

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O0

void __thiscall
amrex::MLEBTensorOp::compCrossTerms(MLEBTensorOp *this,int amrlev,int mglev,MultiFab *mf)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  pointer pFVar4;
  MFItInfo *this_00;
  int idim;
  Box tzbx_2;
  iterator __end5_5;
  iterator __begin5_5;
  range_impl<amrex::Box> *__range5_5;
  Box tybx_2;
  iterator __end5_4;
  iterator __begin5_4;
  range_impl<amrex::Box> *__range5_4;
  Box txbx_2;
  iterator __end5_3;
  iterator __begin5_3;
  range_impl<amrex::Box> *__range5_3;
  Array4<const_amrex::EBCellFlag> *flag;
  Array4<const_double> *apz;
  Array4<const_double> *apy;
  Array4<const_double> *apx;
  Box tzbx_1;
  iterator __end5_2;
  iterator __begin5_2;
  range_impl<amrex::Box> *__range5_2;
  Box tybx_1;
  iterator __end5_1;
  iterator __begin5_1;
  range_impl<amrex::Box> *__range5_1;
  Box txbx_1;
  iterator __end5;
  iterator __begin5;
  range_impl<amrex::Box> *__range5;
  Array4<const_double> kapzfab;
  Array4<const_double> kapyfab;
  Array4<const_double> kapxfab;
  Array4<const_double> etazfab;
  Array4<const_double> etayfab;
  Array4<const_double> etaxfab;
  Array4<const_double> vfab;
  Array4<double> fzfab_1;
  Array4<double> fyfab_1;
  Array4<double> fxfab_1;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Box tzbx;
  iterator __end4_2;
  iterator __begin4_2;
  range_impl<amrex::Box> *__range4_2;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Box tybx;
  iterator __end4_1;
  iterator __begin4_1;
  range_impl<amrex::Box> *__range4_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box txbx;
  iterator __end4;
  iterator __begin4;
  range_impl<amrex::Box> *__range4;
  Array4<double> *fzfab;
  Array4<double> *fyfab;
  Array4<double> *fxfab;
  Box result;
  FabType fabtyp;
  Box zbx;
  Box ybx;
  Box xbx;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  Array<MultiFab,_3> *fluxmf;
  Array<MultiFab,_3> *kapmf;
  Array<MultiFab,_3> *etamf;
  GpuArray<double,_3U> dxinv;
  Geometry *geom;
  Array<const_MultiCutFab_*,_3> area;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  Real mut;
  Real mun;
  Real xif;
  Real divu;
  Real dwdz;
  Real dudz;
  Real dvdy;
  Real dudy;
  int i_3;
  int j_3;
  int k_3;
  Real twoThirds;
  Dim3 hi;
  Dim3 lo;
  Real dzi;
  Real dyi;
  Real mut_1;
  Real mun_1;
  Real xif_1;
  Real divu_1;
  Real dwdz_1;
  Real dvdz;
  Real dvdx;
  Real dudx;
  int i_4;
  int j_4;
  int k_4;
  Real twoThirds_1;
  Dim3 hi_1;
  Dim3 lo_1;
  Real dzi_1;
  Real dxi;
  Real mut_2;
  Real mun_2;
  Real xif_2;
  Real divu_2;
  Real dwdy;
  Real dvdy_1;
  Real dwdx;
  Real dudx_1;
  int i_5;
  int j_5;
  int k_5;
  Real twoThirds_2;
  Dim3 hi_2;
  Dim3 lo_2;
  Real dyi_1;
  Real dxi_1;
  Real mut_3;
  Real mun_3;
  Real xif_3;
  Real divu_3;
  Real dwdz_2;
  Real dudz_1;
  int klom;
  int klop;
  int khim;
  int khip;
  Real dvdy_2;
  Real dudy_1;
  Real wlo;
  Real whi;
  int jlom;
  int jlop;
  int jhim;
  int jhip;
  int i_6;
  int j_6;
  int k_6;
  Real twoThirds_3;
  Dim3 hi_3;
  Dim3 lo_3;
  Real dzi_2;
  Real dyi_2;
  Real mut_4;
  Real mun_4;
  Real xif_4;
  Real divu_4;
  Real dwdz_3;
  Real dvdz_1;
  int klom_1;
  int klop_1;
  int khim_1;
  int khip_1;
  Real dvdx_1;
  Real dudx_2;
  Real wlo_1;
  Real whi_1;
  int ilom;
  int ilop;
  int ihim;
  int ihip;
  int i_7;
  int j_7;
  int k_7;
  Real twoThirds_4;
  Dim3 hi_4;
  Dim3 lo_4;
  Real dzi_3;
  Real dxi_2;
  Real mut_5;
  Real mun_5;
  Real xif_5;
  Real divu_5;
  Real dwdy_1;
  Real dvdy_3;
  int jlom_1;
  int jlop_1;
  int jhim_1;
  int jhip_1;
  Real dwdx_1;
  Real dudx_3;
  Real wlo_2;
  Real whi_2;
  int ilom_1;
  int ilop_1;
  int ihim_1;
  int ihip_1;
  int i_8;
  int j_8;
  int k_8;
  Real twoThirds_5;
  Dim3 hi_5;
  Dim3 lo_5;
  Real dyi_3;
  Real dxi_3;
  int n_26;
  int n_25;
  int n_24;
  int n_23;
  int n_22;
  int n_21;
  int n_20;
  int n_19;
  int n_18;
  int n_17;
  int n_16;
  int n_15;
  int n_14;
  int n_13;
  int n_12;
  int n_11;
  int n_10;
  int n_9;
  int n_8;
  int n_7;
  int n_6;
  int n_5;
  int n_4;
  int n_3;
  MFIter *in_stack_ffffffffffffd318;
  MultiCutFab *in_stack_ffffffffffffd320;
  FabArray<amrex::EBCellFlagFab> *in_stack_ffffffffffffd328;
  MFItInfo *in_stack_ffffffffffffd330;
  MFItInfo *in_stack_ffffffffffffd338;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffd340;
  FabArrayBase *in_stack_ffffffffffffd348;
  Geometry *in_stack_ffffffffffffd350;
  double local_2c90;
  double local_2c88;
  MFIter *in_stack_ffffffffffffd380;
  MFIter *in_stack_ffffffffffffd388;
  MFIter *in_stack_ffffffffffffd390;
  double local_2c48;
  double local_2c40;
  double local_2c30;
  double local_2c28;
  double local_2c08;
  double local_2c00;
  double local_2bf0;
  double local_2be8;
  Box *in_stack_ffffffffffffd440;
  EBCellFlagFab *in_stack_ffffffffffffd448;
  EBCellFlagFab *local_2bb0;
  double local_2b98;
  double local_2b90;
  double local_2b68;
  double local_2b60;
  double local_2b48;
  double local_2b40;
  FabType local_2ae4;
  FabArray<amrex::EBCellFlagFab> *local_2ae0;
  long local_2ad8;
  int local_2aa0;
  Box local_2a9c;
  iterator local_2a80;
  iterator local_2a68;
  undefined1 local_2a50 [40];
  undefined1 *local_2a28;
  Box local_2a1c;
  iterator local_2a00;
  iterator local_29e8;
  undefined1 local_29d0 [40];
  undefined1 *local_29a8;
  Box local_299c;
  iterator local_2980;
  iterator local_2968;
  undefined1 local_2950 [40];
  undefined1 *local_2928;
  long local_2920 [8];
  long *local_28e0;
  long local_28d8 [8];
  long *local_2898;
  long local_2890 [8];
  long *local_2850;
  long local_2848 [8];
  long *local_2808;
  Box local_27fc;
  iterator local_27e0;
  iterator local_27c8;
  undefined1 local_27b0 [40];
  undefined1 *local_2788;
  Box local_277c;
  iterator local_2760;
  iterator local_2748;
  undefined1 local_2730 [40];
  undefined1 *local_2708;
  Box local_26fc;
  iterator local_26e0;
  iterator local_26c8;
  undefined1 local_26b0 [40];
  undefined1 *local_2688;
  long local_2680;
  long local_2678;
  long local_2670;
  int local_2660;
  int local_265c;
  int local_2658;
  long local_2640;
  long local_2638;
  long local_2630;
  int local_2620;
  int local_261c;
  int local_2618;
  long local_2600;
  long local_25f8;
  long local_25f0;
  int local_25e0;
  int local_25dc;
  int local_25d8;
  long local_25c0;
  long local_25b8;
  long local_25b0;
  long local_25a8;
  int local_25a0;
  int local_259c;
  int local_2598;
  long local_2580;
  long local_2578;
  long local_2570;
  long local_2568;
  int local_2560;
  int local_255c;
  int local_2558;
  long local_2540;
  long local_2538;
  long local_2530;
  long local_2528;
  int local_2520;
  int local_251c;
  int local_2518;
  long local_2500;
  long local_24f8;
  long local_24f0;
  long local_24e8;
  int local_24e0;
  int local_24dc;
  int local_24d8;
  long local_24c0;
  long local_24b8;
  long local_24b0;
  long local_24a8;
  int local_24a0;
  int local_249c;
  int local_2498;
  long local_2480;
  long local_2478;
  long local_2470;
  long local_2468;
  int local_2460;
  int local_245c;
  int local_2458;
  long local_2440;
  long local_2438;
  long local_2430;
  long local_2428;
  int local_2420;
  int local_241c;
  int local_2418;
  int local_2400;
  int local_23fc;
  int local_23f8;
  int local_23f4;
  Box local_23b4;
  iterator local_2398;
  iterator local_2380;
  undefined1 local_2368 [40];
  undefined1 *local_2340;
  int local_2338;
  int local_2334;
  int local_2330;
  int local_232c;
  Box local_22ec;
  iterator local_22d0;
  iterator local_22b8;
  undefined1 local_22a0 [40];
  undefined1 *local_2278;
  int local_2270;
  int local_226c;
  int local_2268;
  int local_2264;
  Box local_2224;
  iterator local_2208;
  iterator local_21f0;
  undefined1 local_21d8 [40];
  undefined1 *local_21b0;
  long local_21a8 [8];
  long *local_2168;
  long local_2160 [8];
  long *local_2120;
  long local_2118 [8];
  long *local_20d8;
  Box local_20d0;
  FabType local_20b4;
  int local_205c [7];
  int *local_2040;
  MFIter local_2038;
  MFItInfo local_1fd4;
  array<amrex::MultiFab,_3UL> *local_1fc0;
  array<amrex::MultiFab,_3UL> *local_1fb8;
  array<amrex::MultiFab,_3UL> *local_1fb0;
  GpuArray<double,_3U> local_1fa8;
  Geometry *local_1f90;
  undefined8 local_1f88;
  undefined8 local_1f80;
  undefined8 local_1f78;
  FabArray<amrex::EBCellFlagFab> *local_1f70;
  long local_1f68;
  undefined4 local_1f44;
  int *local_1f40;
  Box *local_1f28;
  Box *local_1f00;
  Box *local_1ed8;
  Box *local_1eb0;
  Box *local_1e88;
  Box *local_1e60;
  int local_1e48;
  int local_1e44;
  int local_1e40;
  int local_1e3c;
  long *local_1e38;
  int local_1e30;
  int local_1e2c;
  int local_1e28;
  int local_1e24;
  long *local_1e20;
  int local_1e18;
  int local_1e14;
  int local_1e10;
  int local_1e0c;
  long *local_1e08;
  double local_1e00;
  double local_1df8;
  double local_1df0;
  double local_1de8;
  double local_1de0;
  double local_1dd8;
  double local_1dd0;
  double local_1dc8;
  int local_1dbc;
  int local_1db8;
  int local_1db4;
  undefined8 local_1db0;
  GpuArray<double,_3U> *local_1d58;
  long *local_1d50;
  long *local_1d48;
  long *local_1d40;
  long *local_1d38;
  Box *local_1d30;
  Box *local_1d18;
  Box *local_1cf0;
  undefined4 local_1cd8;
  int local_1cd4;
  int local_1cd0;
  int local_1ccc;
  long *local_1cc8;
  undefined4 local_1cc0;
  int local_1cbc;
  int local_1cb8;
  int local_1cb4;
  long *local_1cb0;
  undefined4 local_1ca8;
  int local_1ca4;
  int local_1ca0;
  int local_1c9c;
  long *local_1c98;
  double local_1c90;
  double local_1c88;
  double local_1c80;
  double local_1c78;
  double local_1c70;
  double local_1c68;
  double local_1c60;
  double local_1c58;
  int local_1c4c;
  int local_1c48;
  int local_1c44;
  undefined8 local_1c40;
  GpuArray<double,_3U> *local_1be8;
  long *local_1be0;
  long *local_1bd8;
  long *local_1bd0;
  long *local_1bc8;
  Box *local_1bc0;
  Box *local_1ba8;
  Box *local_1b80;
  undefined4 local_1b68;
  int local_1b64;
  int local_1b60;
  int local_1b5c;
  long *local_1b58;
  undefined4 local_1b50;
  int local_1b4c;
  int local_1b48;
  int local_1b44;
  long *local_1b40;
  undefined4 local_1b38;
  int local_1b34;
  int local_1b30;
  int local_1b2c;
  long *local_1b28;
  double local_1b20;
  double local_1b18;
  double local_1b10;
  double local_1b08;
  double local_1b00;
  double local_1af8;
  double local_1af0;
  double local_1ae8;
  int local_1adc;
  int local_1ad8;
  int local_1ad4;
  undefined8 local_1ad0;
  GpuArray<double,_3U> *local_1a78;
  long *local_1a70;
  long *local_1a68;
  long *local_1a60;
  long *local_1a58;
  Box *local_1a50;
  Box *local_1a38;
  Box *local_1a10;
  undefined4 local_19f8;
  int local_19f4;
  int local_19f0;
  int local_19ec;
  long *local_19e8;
  undefined4 local_19e0;
  int local_19dc;
  int local_19d8;
  int local_19d4;
  long *local_19d0;
  undefined4 local_19c8;
  int local_19c4;
  int local_19c0;
  int local_19bc;
  long *local_19b8;
  double local_19b0;
  double local_19a8;
  double local_19a0;
  double local_1998;
  double local_1990;
  double local_1988;
  int local_1980;
  int local_197c;
  int local_1978;
  int local_1974;
  double local_1970;
  double local_1968;
  EBCellFlagFab *local_1960;
  double local_1958;
  int local_194c;
  int local_1948;
  int local_1944;
  int local_1940;
  int local_193c;
  int local_1938;
  int local_1934;
  undefined8 local_1930;
  GpuArray<double,_3U> *local_18d8;
  long *local_18d0;
  long *local_18c8;
  long *local_18c0;
  long *local_18b8;
  long *local_18b0;
  long *local_18a8;
  Box *local_18a0;
  Box *local_1888;
  Box *local_1860;
  undefined4 local_1848;
  int local_1844;
  int local_1840;
  int local_183c;
  long *local_1838;
  undefined4 local_1830;
  int local_182c;
  int local_1828;
  int local_1824;
  long *local_1820;
  undefined4 local_1818;
  int local_1814;
  int local_1810;
  int local_180c;
  long *local_1808;
  undefined4 local_1800;
  int local_17fc;
  int local_17f8;
  int local_17f4;
  long *local_17f0;
  undefined4 local_17e8;
  int local_17e4;
  int local_17e0;
  int local_17dc;
  long *local_17d8;
  undefined4 local_17d0;
  int local_17cc;
  int local_17c8;
  int local_17c4;
  long *local_17c0;
  double local_17b8;
  double local_17b0;
  double local_17a8;
  double local_17a0;
  double local_1798;
  double local_1790;
  int local_1788;
  int local_1784;
  int local_1780;
  int local_177c;
  double local_1778;
  double local_1770;
  double local_1768;
  double local_1760;
  int local_1754;
  int local_1750;
  int local_174c;
  int local_1748;
  int local_1744;
  int local_1740;
  int local_173c;
  undefined8 local_1738;
  GpuArray<double,_3U> *local_16e0;
  long *local_16d8;
  long *local_16d0;
  long *local_16c8;
  long *local_16c0;
  long *local_16b8;
  long *local_16b0;
  Box *local_16a8;
  Box *local_1690;
  Box *local_1668;
  undefined4 local_1650;
  int local_164c;
  int local_1648;
  int local_1644;
  long *local_1640;
  undefined4 local_1638;
  int local_1634;
  int local_1630;
  int local_162c;
  long *local_1628;
  undefined4 local_1620;
  int local_161c;
  int local_1618;
  int local_1614;
  long *local_1610;
  undefined4 local_1608;
  int local_1604;
  int local_1600;
  int local_15fc;
  long *local_15f8;
  undefined4 local_15f0;
  int local_15ec;
  int local_15e8;
  int local_15e4;
  long *local_15e0;
  undefined4 local_15d8;
  int local_15d4;
  int local_15d0;
  int local_15cc;
  long *local_15c8;
  double local_15c0;
  double local_15b8;
  double local_15b0;
  double local_15a8;
  double local_15a0;
  double local_1598;
  int local_1590;
  int local_158c;
  int local_1588;
  int local_1584;
  double local_1580;
  double local_1578;
  MFItInfo *local_1570;
  Geometry *local_1568;
  int local_155c;
  int local_1558;
  int local_1554;
  int local_1550;
  int local_154c;
  int local_1548;
  int local_1544;
  undefined8 local_1540;
  GpuArray<double,_3U> *local_14e8;
  long *local_14e0;
  long *local_14d8;
  long *local_14d0;
  long *local_14c8;
  long *local_14c0;
  long *local_14b8;
  Box *local_14b0;
  Box *local_1498;
  Box *local_1470;
  undefined4 local_1458;
  int local_1454;
  int local_1450;
  int local_144c;
  long *local_1448;
  undefined4 local_1440;
  int local_143c;
  int local_1438;
  int local_1434;
  long *local_1430;
  undefined4 local_1428;
  int local_1424;
  int local_1420;
  int local_141c;
  long *local_1418;
  undefined4 local_1410;
  int local_140c;
  int local_1408;
  int local_1404;
  long *local_1400;
  undefined4 local_13f8;
  int local_13f4;
  int local_13f0;
  int local_13ec;
  long *local_13e8;
  undefined4 local_13e0;
  int local_13dc;
  int local_13d8;
  int local_13d4;
  long *local_13d0;
  undefined4 local_13c8;
  int local_13c4;
  int local_13c0;
  int local_13bc;
  long *local_13b8;
  undefined4 local_13b0;
  int local_13ac;
  int local_13a8;
  int local_13a4;
  long *local_13a0;
  undefined4 local_1398;
  int local_1394;
  int local_1390;
  int local_138c;
  long *local_1388;
  undefined4 local_1380;
  int local_137c;
  int local_1378;
  int local_1374;
  long *local_1370;
  undefined4 local_1368;
  int local_1364;
  int local_1360;
  int local_135c;
  long *local_1358;
  undefined4 local_1350;
  int local_134c;
  int local_1348;
  int local_1344;
  long *local_1340;
  undefined4 local_1338;
  int local_1334;
  int local_1330;
  int local_132c;
  long *local_1328;
  undefined4 local_1320;
  int local_131c;
  int local_1318;
  int local_1314;
  long *local_1310;
  undefined4 local_1308;
  int local_1304;
  int local_1300;
  int local_12fc;
  long *local_12f8;
  undefined4 local_12f0;
  int local_12ec;
  int local_12e8;
  int local_12e4;
  long *local_12e0;
  undefined4 local_12d8;
  int local_12d4;
  int local_12d0;
  int local_12cc;
  long *local_12c8;
  undefined4 local_12c0;
  int local_12bc;
  int local_12b8;
  int local_12b4;
  long *local_12b0;
  undefined4 local_12a8;
  int local_12a4;
  int local_12a0;
  int local_129c;
  long *local_1298;
  undefined4 local_1290;
  int local_128c;
  int local_1288;
  int local_1284;
  long *local_1280;
  undefined4 local_1278;
  int local_1274;
  int local_1270;
  int local_126c;
  long *local_1268;
  undefined4 local_1260;
  int local_125c;
  int local_1258;
  int local_1254;
  long *local_1250;
  undefined4 local_1248;
  int local_1244;
  int local_1240;
  int local_123c;
  long *local_1238;
  undefined4 local_1230;
  int local_122c;
  int local_1228;
  int local_1224;
  long *local_1220;
  undefined4 local_1218;
  int local_1214;
  int local_1210;
  int local_120c;
  long *local_1208;
  undefined4 local_1200;
  int local_11fc;
  int local_11f8;
  int local_11f4;
  long *local_11f0;
  undefined4 local_11e8;
  int local_11e4;
  int local_11e0;
  int local_11dc;
  long *local_11d8;
  undefined4 local_11d0;
  int local_11cc;
  int local_11c8;
  int local_11c4;
  long *local_11c0;
  undefined4 local_11b8;
  int local_11b4;
  int local_11b0;
  int local_11ac;
  long *local_11a8;
  undefined4 local_11a0;
  int local_119c;
  int local_1198;
  int local_1194;
  long *local_1190;
  undefined4 local_1188;
  int local_1184;
  int local_1180;
  int local_117c;
  long *local_1178;
  undefined4 local_1170;
  int local_116c;
  int local_1168;
  int local_1164;
  long *local_1160;
  undefined4 local_1158;
  int local_1154;
  int local_1150;
  int local_114c;
  long *local_1148;
  undefined4 local_1140;
  int local_113c;
  int local_1138;
  int local_1134;
  long *local_1130;
  undefined4 local_1128;
  int local_1124;
  int local_1120;
  int local_111c;
  long *local_1118;
  undefined4 local_1110;
  int local_110c;
  int local_1108;
  int local_1104;
  long *local_1100;
  undefined4 local_10f8;
  int local_10f4;
  int local_10f0;
  int local_10ec;
  long *local_10e8;
  undefined4 local_10e0;
  int local_10dc;
  int local_10d8;
  int local_10d4;
  long *local_10d0;
  undefined4 local_10c8;
  int local_10c4;
  int local_10c0;
  int local_10bc;
  long *local_10b8;
  undefined4 local_10b0;
  int local_10ac;
  int local_10a8;
  int local_10a4;
  long *local_10a0;
  undefined4 local_1098;
  int local_1094;
  int local_1090;
  int local_108c;
  long *local_1088;
  undefined4 local_1080;
  int local_107c;
  int local_1078;
  int local_1074;
  long *local_1070;
  undefined4 local_1068;
  int local_1064;
  int local_1060;
  int local_105c;
  long *local_1058;
  undefined4 local_1050;
  int local_104c;
  int local_1048;
  int local_1044;
  long *local_1040;
  undefined4 local_1038;
  int local_1034;
  int local_1030;
  int local_102c;
  long *local_1028;
  undefined4 local_1020;
  int local_101c;
  int local_1018;
  int local_1014;
  long *local_1010;
  undefined4 local_1008;
  int local_1004;
  int local_1000;
  int local_ffc;
  long *local_ff8;
  undefined4 local_ff0;
  int local_fec;
  int local_fe8;
  int local_fe4;
  long *local_fe0;
  undefined4 local_fd8;
  int local_fd4;
  int local_fd0;
  int local_fcc;
  long *local_fc8;
  undefined4 local_fc0;
  int local_fbc;
  int local_fb8;
  int local_fb4;
  long *local_fb0;
  undefined4 local_fa8;
  int local_fa4;
  int local_fa0;
  int local_f9c;
  long *local_f98;
  undefined4 local_f90;
  int local_f8c;
  int local_f88;
  int local_f84;
  long *local_f80;
  undefined4 local_f78;
  int local_f74;
  int local_f70;
  int local_f6c;
  long *local_f68;
  undefined4 local_f60;
  int local_f5c;
  int local_f58;
  int local_f54;
  long *local_f50;
  undefined4 local_f48;
  int local_f44;
  int local_f40;
  int local_f3c;
  long *local_f38;
  undefined4 local_f30;
  int local_f2c;
  int local_f28;
  int local_f24;
  long *local_f20;
  undefined4 local_f18;
  int local_f14;
  int local_f10;
  int local_f0c;
  long *local_f08;
  undefined4 local_f00;
  int local_efc;
  int local_ef8;
  int local_ef4;
  long *local_ef0;
  undefined4 local_ee8;
  int local_ee4;
  int local_ee0;
  int local_edc;
  long *local_ed8;
  undefined4 local_ed0;
  int local_ecc;
  int local_ec8;
  int local_ec4;
  long *local_ec0;
  undefined4 local_eb8;
  int local_eb4;
  int local_eb0;
  int local_eac;
  long *local_ea8;
  undefined4 local_ea0;
  int local_e9c;
  int local_e98;
  int local_e94;
  long *local_e90;
  undefined4 local_e88;
  int local_e84;
  int local_e80;
  int local_e7c;
  long *local_e78;
  undefined4 local_e70;
  int local_e6c;
  int local_e68;
  int local_e64;
  long *local_e60;
  undefined4 local_e58;
  int local_e54;
  int local_e50;
  int local_e4c;
  long *local_e48;
  undefined4 local_e40;
  int local_e3c;
  int local_e38;
  int local_e34;
  long *local_e30;
  undefined4 local_e28;
  int local_e24;
  int local_e20;
  int local_e1c;
  long *local_e18;
  undefined4 local_e10;
  int local_e0c;
  int local_e08;
  int local_e04;
  long *local_e00;
  undefined4 local_df8;
  int local_df4;
  int local_df0;
  int local_dec;
  long *local_de8;
  undefined4 local_de0;
  int local_ddc;
  int local_dd8;
  int local_dd4;
  long *local_dd0;
  undefined4 local_dc8;
  int local_dc4;
  int local_dc0;
  int local_dbc;
  long *local_db8;
  undefined4 local_db0;
  int local_dac;
  int local_da8;
  int local_da4;
  long *local_da0;
  undefined4 local_d98;
  int local_d94;
  int local_d90;
  int local_d8c;
  long *local_d88;
  undefined4 local_d80;
  int local_d7c;
  int local_d78;
  int local_d74;
  long *local_d70;
  undefined4 local_d68;
  int local_d64;
  int local_d60;
  int local_d5c;
  long *local_d58;
  undefined4 local_d50;
  int local_d4c;
  int local_d48;
  int local_d44;
  long *local_d40;
  undefined4 local_d38;
  int local_d34;
  int local_d30;
  int local_d2c;
  long *local_d28;
  undefined4 local_d20;
  int local_d1c;
  int local_d18;
  int local_d14;
  long *local_d10;
  undefined4 local_d08;
  int local_d04;
  int local_d00;
  int local_cfc;
  long *local_cf8;
  undefined4 local_cf0;
  int local_cec;
  int local_ce8;
  int local_ce4;
  long *local_ce0;
  undefined4 local_cd8;
  int local_cd4;
  int local_cd0;
  int local_ccc;
  long *local_cc8;
  undefined4 local_cc0;
  int local_cbc;
  int local_cb8;
  int local_cb4;
  long *local_cb0;
  undefined4 local_ca8;
  int local_ca4;
  int local_ca0;
  int local_c9c;
  long *local_c98;
  undefined4 local_c90;
  int local_c8c;
  int local_c88;
  int local_c84;
  long *local_c80;
  undefined4 local_c78;
  int local_c74;
  int local_c70;
  int local_c6c;
  long *local_c68;
  undefined4 local_c60;
  int local_c5c;
  int local_c58;
  int local_c54;
  long *local_c50;
  undefined4 local_c48;
  int local_c44;
  int local_c40;
  int local_c3c;
  long *local_c38;
  undefined4 local_c30;
  int local_c2c;
  int local_c28;
  int local_c24;
  long *local_c20;
  undefined4 local_c18;
  int local_c14;
  int local_c10;
  int local_c0c;
  long *local_c08;
  undefined4 local_c00;
  int local_bfc;
  int local_bf8;
  int local_bf4;
  long *local_bf0;
  undefined4 local_be8;
  int local_be4;
  int local_be0;
  int local_bdc;
  long *local_bd8;
  undefined4 local_bd0;
  int local_bcc;
  int local_bc8;
  int local_bc4;
  long *local_bc0;
  undefined4 local_bb8;
  int local_bb4;
  int local_bb0;
  int local_bac;
  long *local_ba8;
  undefined4 local_ba0;
  int local_b9c;
  int local_b98;
  int local_b94;
  long *local_b90;
  undefined4 local_b88;
  int local_b84;
  int local_b80;
  int local_b7c;
  long *local_b78;
  undefined4 local_b70;
  int local_b6c;
  int local_b68;
  int local_b64;
  long *local_b60;
  undefined4 local_b58;
  int local_b54;
  int local_b50;
  int local_b4c;
  long *local_b48;
  undefined4 local_b40;
  int local_b3c;
  int local_b38;
  int local_b34;
  long *local_b30;
  undefined4 local_b28;
  int local_b24;
  int local_b20;
  int local_b1c;
  long *local_b18;
  undefined4 local_b10;
  int local_b0c;
  int local_b08;
  int local_b04;
  long *local_b00;
  undefined4 local_af8;
  int local_af4;
  int local_af0;
  int local_aec;
  long *local_ae8;
  undefined4 local_ae0;
  int local_adc;
  int local_ad8;
  int local_ad4;
  long *local_ad0;
  undefined4 local_ac8;
  int local_ac4;
  int local_ac0;
  int local_abc;
  long *local_ab8;
  undefined4 local_ab0;
  int local_aac;
  int local_aa8;
  int local_aa4;
  long *local_aa0;
  undefined4 local_a98;
  int local_a94;
  int local_a90;
  int local_a8c;
  long *local_a88;
  undefined4 local_a80;
  int local_a7c;
  int local_a78;
  int local_a74;
  long *local_a70;
  undefined4 local_a68;
  int local_a64;
  int local_a60;
  int local_a5c;
  long *local_a58;
  undefined4 local_a50;
  int local_a4c;
  int local_a48;
  int local_a44;
  long *local_a40;
  undefined4 local_a38;
  int local_a34;
  int local_a30;
  int local_a2c;
  long *local_a28;
  undefined4 local_a20;
  int local_a1c;
  int local_a18;
  int local_a14;
  long *local_a10;
  undefined4 local_a08;
  int local_a04;
  int local_a00;
  int local_9fc;
  long *local_9f8;
  undefined4 local_9f0;
  int local_9ec;
  int local_9e8;
  int local_9e4;
  long *local_9e0;
  undefined4 local_9d8;
  int local_9d4;
  int local_9d0;
  int local_9cc;
  long *local_9c8;
  undefined4 local_9c0;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  long *local_9b0;
  undefined4 local_9a4;
  IntVect *local_9a0;
  undefined4 local_994;
  IntVect *local_990;
  undefined4 local_984;
  IntVect *local_980;
  undefined4 local_974;
  Box *local_970;
  undefined4 local_964;
  Box *local_960;
  undefined4 local_954;
  Box *local_950;
  undefined4 local_944;
  IntVect *local_940;
  undefined4 local_934;
  IntVect *local_930;
  undefined4 local_924;
  IntVect *local_920;
  undefined4 local_914;
  Box *local_910;
  undefined4 local_904;
  Box *local_900;
  undefined4 local_8f4;
  Box *local_8f0;
  undefined4 local_8e4;
  IntVect *local_8e0;
  undefined4 local_8d4;
  IntVect *local_8d0;
  undefined4 local_8c4;
  IntVect *local_8c0;
  undefined4 local_8b4;
  Box *local_8b0;
  undefined4 local_8a4;
  Box *local_8a0;
  undefined4 local_894;
  Box *local_890;
  undefined4 local_884;
  IntVect *local_880;
  undefined4 local_874;
  IntVect *local_870;
  undefined4 local_864;
  IntVect *local_860;
  undefined4 local_854;
  Box *local_850;
  undefined4 local_844;
  Box *local_840;
  undefined4 local_834;
  Box *local_830;
  undefined4 local_824;
  IntVect *local_820;
  undefined4 local_814;
  IntVect *local_810;
  undefined4 local_804;
  IntVect *local_800;
  undefined4 local_7f4;
  Box *local_7f0;
  undefined4 local_7e4;
  Box *local_7e0;
  undefined4 local_7d4;
  Box *local_7d0;
  undefined4 local_7c4;
  IntVect *local_7c0;
  undefined4 local_7b4;
  IntVect *local_7b0;
  undefined4 local_7a4;
  IntVect *local_7a0;
  undefined4 local_794;
  Box *local_790;
  undefined4 local_784;
  Box *local_780;
  undefined4 local_774;
  Box *local_770;
  undefined4 local_764;
  IntVect *local_760;
  undefined4 local_754;
  IntVect *local_750;
  undefined4 local_744;
  IntVect *local_740;
  undefined4 local_734;
  IntVect *local_730;
  undefined4 local_724;
  IntVect *local_720;
  undefined4 local_714;
  IntVect *local_710;
  undefined4 local_704;
  IntVect *local_700;
  undefined4 local_6f4;
  IntVect *local_6f0;
  undefined4 local_6e4;
  IntVect *local_6e0;
  undefined4 local_6d4;
  Box *local_6d0;
  undefined4 local_6c4;
  Box *local_6c0;
  undefined4 local_6b4;
  Box *local_6b0;
  undefined4 local_6a4;
  Box *local_6a0;
  undefined4 local_694;
  Box *local_690;
  undefined4 local_684;
  Box *local_680;
  undefined4 local_674;
  Box *local_670;
  undefined4 local_664;
  Box *local_660;
  undefined4 local_654;
  Box *local_650;
  undefined4 local_644;
  GpuArray<double,_3U> *local_640;
  undefined4 local_634;
  GpuArray<double,_3U> *local_630;
  undefined4 local_624;
  GpuArray<double,_3U> *local_620;
  undefined4 local_614;
  GpuArray<double,_3U> *local_610;
  undefined4 local_604;
  GpuArray<double,_3U> *local_600;
  undefined4 local_5f4;
  GpuArray<double,_3U> *local_5f0;
  undefined4 local_5e4;
  GpuArray<double,_3U> *local_5e0;
  undefined4 local_5d4;
  GpuArray<double,_3U> *local_5d0;
  undefined4 local_5c4;
  GpuArray<double,_3U> *local_5c0;
  undefined4 local_5b4;
  GpuArray<double,_3U> *local_5b0;
  undefined4 local_5a4;
  GpuArray<double,_3U> *local_5a0;
  undefined4 local_594;
  GpuArray<double,_3U> *local_590;
  int local_584;
  int local_580;
  int local_57c;
  long *local_578;
  int local_56c;
  int local_568;
  int local_564;
  long *local_560;
  int local_554;
  int local_550;
  int local_54c;
  long *local_548;
  int local_53c;
  int local_538;
  int local_534;
  long *local_530;
  int local_524;
  int local_520;
  int local_51c;
  long *local_518;
  int local_50c;
  int local_508;
  int local_504;
  long *local_500;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  long *local_4e8;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  long *local_4d0;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  long *local_4b8;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  long *local_4a0;
  int local_494;
  int local_490;
  int local_48c;
  long *local_488;
  int local_47c;
  int local_478;
  int local_474;
  long *local_470;
  int local_464;
  int local_460;
  int local_45c;
  long *local_458;
  int local_44c;
  int local_448;
  int local_444;
  long *local_440;
  int local_434;
  int local_430;
  int local_42c;
  long *local_428;
  int local_41c;
  int local_418;
  int local_414;
  long *local_410;
  int local_404;
  int local_400;
  int local_3fc;
  long *local_3f8;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  long *local_3e0;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  long *local_3c8;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  long *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  long *local_398;
  int local_38c;
  int local_388;
  int local_384;
  long *local_380;
  int local_374;
  int local_370;
  int local_36c;
  long *local_368;
  int local_35c;
  int local_358;
  int local_354;
  long *local_350;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_32c;
  int local_328;
  int local_324;
  long *local_320;
  int local_314;
  int local_310;
  int local_30c;
  long *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  long *local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  long *local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  long *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  long *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  long *local_290;
  int local_284;
  int local_280;
  int local_27c;
  long *local_278;
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 local_268;
  undefined4 local_264;
  uint *local_260;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  uint *local_248;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined4 local_234;
  uint *local_230;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  undefined4 local_21c;
  uint *local_218;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  uint *local_200;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  uint *local_1e8;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  uint *local_1d0;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  uint *local_1b8;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined4 local_1a4;
  uint *local_1a0;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  uint *local_188;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 local_174;
  uint *local_170;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  uint *local_158;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  uint *local_140;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  uint *local_128;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  uint *local_110;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  uint *local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  uint *local_e0;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  uint *local_c8;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  uint *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  uint *local_98;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  uint *local_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  uint *local_68;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  uint *local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  uint *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd320,(size_type)in_stack_ffffffffffffd318);
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_stack_ffffffffffffd320,(size_type)in_stack_ffffffffffffd318);
  pFVar4 = std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)in_stack_ffffffffffffd320);
  if (pFVar4 == (pointer)0x0) {
    local_2ad8 = 0;
  }
  else {
    local_2ad8 = __dynamic_cast(pFVar4,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo,0);
  }
  local_1f68 = local_2ad8;
  if (local_2ad8 == 0) {
    local_2ae0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_2ae0 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                           ((EBFArrayBoxFactory *)in_stack_ffffffffffffd320);
  }
  local_1f70 = local_2ae0;
  if (local_1f68 == 0) {
    memset(&local_1f88,0,0x18);
    local_1f88 = 0;
    local_1f80 = 0;
    local_1f78 = 0;
  }
  else {
    EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffd320);
  }
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffd320,(size_type)in_stack_ffffffffffffd318);
  local_1f90 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                         ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                          in_stack_ffffffffffffd320,(size_type)in_stack_ffffffffffffd318);
  CoordSys::InvCellSizeArray(&local_1fa8,&local_1f90->super_CoordSys);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffd320,(size_type)in_stack_ffffffffffffd318);
  local_1fb0 = Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                             *)in_stack_ffffffffffffd320,(size_type)in_stack_ffffffffffffd318);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffd320,(size_type)in_stack_ffffffffffffd318);
  local_1fb8 = Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                             *)in_stack_ffffffffffffd320,(size_type)in_stack_ffffffffffffd318);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffd320,(size_type)in_stack_ffffffffffffd318);
  local_1fc0 = Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                             *)in_stack_ffffffffffffd320,(size_type)in_stack_ffffffffffffd318);
  MFItInfo::MFItInfo(in_stack_ffffffffffffd330);
  this_00 = MFItInfo::EnableTiling(&local_1fd4,(IntVect *)&FabArrayBase::mfiter_tile_size);
  MFItInfo::SetDynamic(this_00,true);
  MFIter::MFIter((MFIter *)in_stack_ffffffffffffd350,in_stack_ffffffffffffd348,
                 (MFItInfo *)in_stack_ffffffffffffd340);
  while (bVar3 = MFIter::isValid(&local_2038), bVar3) {
    MFIter::tilebox(in_stack_ffffffffffffd380);
    local_2040 = local_205c;
    MFIter::nodaltilebox(in_stack_ffffffffffffd390,(int)((ulong)in_stack_ffffffffffffd388 >> 0x20));
    MFIter::nodaltilebox(in_stack_ffffffffffffd390,(int)((ulong)in_stack_ffffffffffffd388 >> 0x20));
    MFIter::nodaltilebox(in_stack_ffffffffffffd390,(int)((ulong)in_stack_ffffffffffffd388 >> 0x20));
    if (local_1f70 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      local_2ae4 = regular;
    }
    else {
      FabArray<amrex::EBCellFlagFab>::operator[]
                ((FabArray<amrex::EBCellFlagFab> *)in_stack_ffffffffffffd320,
                 in_stack_ffffffffffffd318);
      local_1f40 = local_2040;
      local_1f44 = 1;
      local_20d0.smallend.vect._0_8_ = *(undefined8 *)local_2040;
      local_20d0.smallend.vect[2] = local_2040[2];
      local_20d0.bigend.vect[0] = local_2040[3];
      local_20d0.bigend.vect._4_8_ = *(undefined8 *)(local_2040 + 4);
      local_20d0.btype.itype = local_2040[6];
      Box::grow(&local_20d0,1);
      local_2ae4 = EBCellFlagFab::getType(in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
    }
    local_20b4 = local_2ae4;
    if (local_2ae4 == covered) {
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      local_20d8 = local_2118;
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      local_2120 = local_2160;
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      local_2168 = local_21a8;
      Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffd320);
      local_21b0 = local_21d8;
      Gpu::range_detail::range_impl<amrex::Box>::begin
                ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
      Gpu::range_detail::range_impl<amrex::Box>::end
                ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
      while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                               (&local_21f0,&local_2208), bVar3) {
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_2224,&local_21f0);
        local_6b4 = 0;
        local_6c4 = 1;
        local_6d4 = 2;
        local_740 = &local_2224.bigend;
        local_744 = 0;
        local_750 = &local_2224.bigend;
        local_754 = 1;
        local_760 = &local_2224.bigend;
        local_764 = 2;
        for (local_2264 = 0; iVar2 = local_2224.smallend.vect[2], local_2264 < 3;
            local_2264 = local_2264 + 1) {
          while (local_2268 = iVar2, iVar2 = local_2224.smallend.vect[1],
                local_2268 <= local_2224.bigend.vect[2]) {
            while (local_226c = iVar2, iVar2 = local_2224.smallend.vect[0],
                  local_226c <= local_2224.bigend.vect[1]) {
              while (local_2270 = iVar2, local_2270 <= local_2224.bigend.vect[0]) {
                local_1e08 = local_20d8;
                local_1e0c = local_2270;
                local_1e10 = local_226c;
                local_1e14 = local_2268;
                local_1e18 = local_2264;
                *(undefined8 *)
                 (*local_20d8 +
                 ((long)(local_2270 - (int)local_20d8[4]) +
                  (long)(local_226c - *(int *)((long)local_20d8 + 0x24)) * local_20d8[1] +
                  (long)(local_2268 - (int)local_20d8[5]) * local_20d8[2] +
                 (long)local_2264 * local_20d8[3]) * 8) = 0;
                iVar2 = local_2270 + 1;
              }
              iVar2 = local_226c + 1;
            }
            iVar2 = local_2268 + 1;
          }
        }
        local_1ed8 = &local_2224;
        local_1e60 = &local_2224;
        local_6d0 = &local_2224;
        local_6c0 = &local_2224;
        local_6b0 = &local_2224;
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_21f0);
      }
      Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffd320);
      local_2278 = local_22a0;
      Gpu::range_detail::range_impl<amrex::Box>::begin
                ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
      Gpu::range_detail::range_impl<amrex::Box>::end
                ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
      while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                               (&local_22b8,&local_22d0), bVar3) {
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_22ec,&local_22b8);
        local_684 = 0;
        local_694 = 1;
        local_6a4 = 2;
        local_710 = &local_22ec.bigend;
        local_714 = 0;
        local_720 = &local_22ec.bigend;
        local_724 = 1;
        local_730 = &local_22ec.bigend;
        local_734 = 2;
        for (local_232c = 0; iVar2 = local_22ec.smallend.vect[2], local_232c < 3;
            local_232c = local_232c + 1) {
          while (local_2330 = iVar2, iVar2 = local_22ec.smallend.vect[1],
                local_2330 <= local_22ec.bigend.vect[2]) {
            while (local_2334 = iVar2, iVar2 = local_22ec.smallend.vect[0],
                  local_2334 <= local_22ec.bigend.vect[1]) {
              while (local_2338 = iVar2, local_2338 <= local_22ec.bigend.vect[0]) {
                local_1e20 = local_2120;
                local_1e24 = local_2338;
                local_1e28 = local_2334;
                local_1e2c = local_2330;
                local_1e30 = local_232c;
                *(undefined8 *)
                 (*local_2120 +
                 ((long)(local_2338 - (int)local_2120[4]) +
                  (long)(local_2334 - *(int *)((long)local_2120 + 0x24)) * local_2120[1] +
                  (long)(local_2330 - (int)local_2120[5]) * local_2120[2] +
                 (long)local_232c * local_2120[3]) * 8) = 0;
                iVar2 = local_2338 + 1;
              }
              iVar2 = local_2334 + 1;
            }
            iVar2 = local_2330 + 1;
          }
        }
        local_1f00 = &local_22ec;
        local_1e88 = &local_22ec;
        local_6a0 = &local_22ec;
        local_690 = &local_22ec;
        local_680 = &local_22ec;
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_22b8);
      }
      Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffd320);
      local_2340 = local_2368;
      Gpu::range_detail::range_impl<amrex::Box>::begin
                ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
      Gpu::range_detail::range_impl<amrex::Box>::end
                ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
      while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                               (&local_2380,&local_2398), bVar3) {
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_23b4,&local_2380);
        local_654 = 0;
        local_664 = 1;
        local_674 = 2;
        local_6e0 = &local_23b4.bigend;
        local_6e4 = 0;
        local_6f0 = &local_23b4.bigend;
        local_6f4 = 1;
        local_700 = &local_23b4.bigend;
        local_704 = 2;
        for (local_23f4 = 0; iVar2 = local_23b4.smallend.vect[2], local_23f4 < 3;
            local_23f4 = local_23f4 + 1) {
          while (local_23f8 = iVar2, iVar2 = local_23b4.smallend.vect[1],
                local_23f8 <= local_23b4.bigend.vect[2]) {
            while (local_23fc = iVar2, iVar2 = local_23b4.smallend.vect[0],
                  local_23fc <= local_23b4.bigend.vect[1]) {
              while (local_2400 = iVar2, local_2400 <= local_23b4.bigend.vect[0]) {
                local_1e38 = local_2168;
                local_1e3c = local_2400;
                local_1e40 = local_23fc;
                local_1e44 = local_23f8;
                local_1e48 = local_23f4;
                *(undefined8 *)
                 (*local_2168 +
                 ((long)(local_2400 - (int)local_2168[4]) +
                  (long)(local_23fc - *(int *)((long)local_2168 + 0x24)) * local_2168[1] +
                  (long)(local_23f8 - (int)local_2168[5]) * local_2168[2] +
                 (long)local_23f4 * local_2168[3]) * 8) = 0;
                iVar2 = local_2400 + 1;
              }
              iVar2 = local_23fc + 1;
            }
            iVar2 = local_23f8 + 1;
          }
        }
        local_1f28 = &local_23b4;
        local_1eb0 = &local_23b4;
        local_670 = &local_23b4;
        local_660 = &local_23b4;
        local_650 = &local_23b4;
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_2380);
      }
    }
    else {
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                 (size_type)in_stack_ffffffffffffd318);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffd328,
                 (MFIter *)in_stack_ffffffffffffd320);
      if (local_20b4 == regular) {
        Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffd320);
        local_2688 = local_26b0;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_26c8,&local_26e0), bVar3) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_26fc,&local_26c8);
          local_1d38 = &local_2440;
          local_1d40 = &local_2500;
          local_1d48 = &local_2540;
          local_1d50 = &local_2600;
          local_1d58 = &local_1fa8;
          local_594 = 1;
          local_5a4 = 2;
          local_774 = 0;
          local_784 = 1;
          local_794 = 2;
          local_7a0 = &local_26fc.bigend;
          local_7a4 = 0;
          local_7b0 = &local_26fc.bigend;
          local_7b4 = 1;
          local_7c0 = &local_26fc.bigend;
          local_7c4 = 2;
          local_1db0 = 0x3fe5555555555555;
          for (local_1db4 = local_26fc.smallend.vect[2]; iVar2 = local_26fc.smallend.vect[1],
              local_1db4 <= local_26fc.bigend.vect[2]; local_1db4 = local_1db4 + 1) {
            while (local_1db8 = iVar2, iVar2 = local_26fc.smallend.vect[0],
                  local_1db8 <= local_26fc.bigend.vect[1]) {
              while (local_1dbc = iVar2, local_1dbc <= local_26fc.bigend.vect[0]) {
                local_9b4 = local_1dbc;
                local_9b8 = local_1db8 + 1;
                local_9bc = local_1db4;
                local_9c0 = 0;
                local_9cc = local_1dbc + -1;
                local_9d0 = local_1db8 + 1;
                local_9d4 = local_1db4;
                local_9d8 = 0;
                local_9e4 = local_1dbc;
                local_9e8 = local_1db8 + -1;
                local_9ec = local_1db4;
                local_9f0 = 0;
                local_9fc = local_1dbc + -1;
                local_a00 = local_1db8 + -1;
                local_a04 = local_1db4;
                local_a08 = 0;
                local_1dc8 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_1dbc - local_24e0) +
                                  (local_9b8 - local_24dc) * local_24f8 +
                                 (local_1db4 - local_24d8) * local_24f0) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_9cc - local_24e0) +
                                 (local_9d0 - local_24dc) * local_24f8 +
                                (local_1db4 - local_24d8) * local_24f0) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_1dbc - local_24e0) +
                                (local_9e8 - local_24dc) * local_24f8 +
                               (local_1db4 - local_24d8) * local_24f0) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_9fc - local_24e0) +
                               (local_a00 - local_24dc) * local_24f8 +
                              (local_1db4 - local_24d8) * local_24f0) * 8)) *
                             local_1fa8.arr[1] * 0.25;
                local_a14 = local_1dbc;
                local_a18 = local_1db8 + 1;
                local_a1c = local_1db4;
                local_a20 = 1;
                local_a2c = local_1dbc + -1;
                local_a30 = local_1db8 + 1;
                local_a34 = local_1db4;
                local_a38 = 1;
                local_a44 = local_1dbc;
                local_a48 = local_1db8 + -1;
                local_a4c = local_1db4;
                local_a50 = 1;
                local_a5c = local_1dbc + -1;
                local_a60 = local_1db8 + -1;
                local_a64 = local_1db4;
                local_a68 = 1;
                local_1dd0 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_1dbc - local_24e0) +
                                  (local_a18 - local_24dc) * local_24f8 +
                                  (local_1db4 - local_24d8) * local_24f0 + local_24e8) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_a2c - local_24e0) +
                                 (local_a30 - local_24dc) * local_24f8 +
                                 (local_1db4 - local_24d8) * local_24f0 + local_24e8) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_1dbc - local_24e0) +
                                (local_a48 - local_24dc) * local_24f8 +
                                (local_1db4 - local_24d8) * local_24f0 + local_24e8) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_a5c - local_24e0) +
                               (local_a60 - local_24dc) * local_24f8 +
                               (local_1db4 - local_24d8) * local_24f0 + local_24e8) * 8)) *
                             local_1fa8.arr[1] * 0.25;
                local_a74 = local_1dbc;
                local_a78 = local_1db8;
                local_a7c = local_1db4 + 1;
                local_a80 = 0;
                local_a8c = local_1dbc + -1;
                local_a90 = local_1db8;
                local_a94 = local_1db4 + 1;
                local_a98 = 0;
                local_aa4 = local_1dbc;
                local_aa8 = local_1db8;
                local_aac = local_1db4 + -1;
                local_ab0 = 0;
                local_abc = local_1dbc + -1;
                local_ac0 = local_1db8;
                local_ac4 = local_1db4 + -1;
                local_ac8 = 0;
                local_1dd8 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_1dbc - local_24e0) +
                                  (local_1db8 - local_24dc) * local_24f8 +
                                 (local_a7c - local_24d8) * local_24f0) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_a8c - local_24e0) +
                                 (local_1db8 - local_24dc) * local_24f8 +
                                (local_a94 - local_24d8) * local_24f0) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_1dbc - local_24e0) +
                                (local_1db8 - local_24dc) * local_24f8 +
                               (local_aac - local_24d8) * local_24f0) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_abc - local_24e0) +
                               (local_1db8 - local_24dc) * local_24f8 +
                              (local_ac4 - local_24d8) * local_24f0) * 8)) *
                             local_1fa8.arr[2] * 0.25;
                local_ad4 = local_1dbc;
                local_ad8 = local_1db8;
                local_adc = local_1db4 + 1;
                local_ae0 = 2;
                local_aec = local_1dbc + -1;
                local_af0 = local_1db8;
                local_af4 = local_1db4 + 1;
                local_af8 = 2;
                local_b04 = local_1dbc;
                local_b08 = local_1db8;
                local_b0c = local_1db4 + -1;
                local_b10 = 2;
                local_b1c = local_1dbc + -1;
                local_b20 = local_1db8;
                local_b24 = local_1db4 + -1;
                local_b28 = 2;
                local_1de0 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_1dbc - local_24e0) +
                                  (local_1db8 - local_24dc) * local_24f8 +
                                  (local_adc - local_24d8) * local_24f0 + local_24e8 * 2) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_aec - local_24e0) +
                                 (local_1db8 - local_24dc) * local_24f8 +
                                 (local_af4 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_1dbc - local_24e0) +
                                (local_1db8 - local_24dc) * local_24f8 +
                                (local_b0c - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_b1c - local_24e0) +
                               (local_1db8 - local_24dc) * local_24f8 +
                               (local_b24 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                             local_1fa8.arr[2] * 0.25;
                local_1de8 = local_1dd0 + local_1de0;
                local_27c = local_1dbc;
                local_280 = local_1db8;
                local_284 = local_1db4;
                local_1df0 = *(double *)
                              (local_2600 +
                              ((long)(local_1dbc - local_25e0) +
                               (local_1db8 - local_25dc) * local_25f8 +
                              (local_1db4 - local_25d8) * local_25f0) * 8);
                local_b34 = local_1dbc;
                local_b38 = local_1db8;
                local_b3c = local_1db4;
                local_b40 = 0;
                local_1df8 = (*(double *)
                               (local_2540 +
                               ((long)(local_1dbc - local_2520) +
                                (local_1db8 - local_251c) * local_2538 +
                               (local_1db4 - local_2518) * local_2530) * 8) - local_1df0) * 0.75;
                local_b4c = local_1dbc;
                local_b50 = local_1db8;
                local_b54 = local_1db4;
                local_b58 = 1;
                local_1e00 = *(double *)
                              (local_2540 +
                              ((long)(local_1dbc - local_2520) +
                               (local_1db8 - local_251c) * local_2538 +
                               (local_1db4 - local_2518) * local_2530 + local_2528) * 8);
                local_1c9c = local_1dbc;
                local_1ca0 = local_1db8;
                local_1ca4 = local_1db4;
                local_1ca8 = 0;
                *(double *)
                 (local_2440 +
                 ((long)(local_1dbc - local_2420) + (local_1db8 - local_241c) * local_2438 +
                 (local_1db4 - local_2418) * local_2430) * 8) =
                     -local_1df8 * local_1de8 * -0.6666666666666666 + -(local_1df0 * local_1de8);
                local_1cb4 = local_1dbc;
                local_1cb8 = local_1db8;
                local_1cbc = local_1db4;
                local_1cc0 = 1;
                *(double *)
                 (local_2440 +
                 ((long)(local_1dbc - local_2420) + (local_1db8 - local_241c) * local_2438 +
                  (local_1db4 - local_2418) * local_2430 + local_2428) * 8) =
                     -local_1e00 * local_1dc8;
                local_1ccc = local_1dbc;
                local_1cd0 = local_1db8;
                local_1cd4 = local_1db4;
                local_1cd8 = 2;
                *(double *)
                 (local_2440 +
                 ((long)(local_1dbc - local_2420) + (local_1db8 - local_241c) * local_2438 +
                  (local_1db4 - local_2418) * local_2430 + local_2428 * 2) * 8) =
                     -local_1e00 * local_1dd8;
                local_1cc8 = local_1d38;
                local_1cb0 = local_1d38;
                local_1c98 = local_1d38;
                local_b48 = local_1d48;
                local_b30 = local_1d48;
                local_b18 = local_1d40;
                local_b00 = local_1d40;
                local_ae8 = local_1d40;
                local_ad0 = local_1d40;
                local_ab8 = local_1d40;
                local_aa0 = local_1d40;
                local_a88 = local_1d40;
                local_a70 = local_1d40;
                local_a58 = local_1d40;
                local_a40 = local_1d40;
                local_a28 = local_1d40;
                local_a10 = local_1d40;
                local_9f8 = local_1d40;
                local_9e0 = local_1d40;
                local_9c8 = local_1d40;
                local_9b0 = local_1d40;
                local_278 = local_1d50;
                iVar2 = local_1dbc + 1;
              }
              iVar2 = local_1db8 + 1;
            }
          }
          local_1d30 = &local_26fc;
          local_1d18 = &local_26fc;
          local_1cf0 = &local_26fc;
          local_790 = &local_26fc;
          local_780 = &local_26fc;
          local_770 = &local_26fc;
          local_5a0 = local_1d58;
          local_590 = local_1d58;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_26c8);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffd320);
        local_2708 = local_2730;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_2748,&local_2760), bVar3) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_277c,&local_2748);
          local_1bc8 = &local_2480;
          local_1bd0 = &local_2500;
          local_1bd8 = &local_2580;
          local_1be0 = &local_2640;
          local_1be8 = &local_1fa8;
          local_5b4 = 0;
          local_5c4 = 2;
          local_7d4 = 0;
          local_7e4 = 1;
          local_7f4 = 2;
          local_800 = &local_277c.bigend;
          local_804 = 0;
          local_810 = &local_277c.bigend;
          local_814 = 1;
          local_820 = &local_277c.bigend;
          local_824 = 2;
          local_1c40 = 0x3fe5555555555555;
          for (local_1c44 = local_277c.smallend.vect[2]; iVar2 = local_277c.smallend.vect[1],
              local_1c44 <= local_277c.bigend.vect[2]; local_1c44 = local_1c44 + 1) {
            while (local_1c48 = iVar2, iVar2 = local_277c.smallend.vect[0],
                  local_1c48 <= local_277c.bigend.vect[1]) {
              while (local_1c4c = iVar2, local_1c4c <= local_277c.bigend.vect[0]) {
                local_b64 = local_1c4c + 1;
                local_b68 = local_1c48;
                local_b6c = local_1c44;
                local_b70 = 0;
                local_b7c = local_1c4c + 1;
                local_b80 = local_1c48 + -1;
                local_b84 = local_1c44;
                local_b88 = 0;
                local_b94 = local_1c4c + -1;
                local_b98 = local_1c48;
                local_b9c = local_1c44;
                local_ba0 = 0;
                local_bac = local_1c4c + -1;
                local_bb0 = local_1c48 + -1;
                local_bb4 = local_1c44;
                local_bb8 = 0;
                local_1c58 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_b64 - local_24e0) +
                                  (local_1c48 - local_24dc) * local_24f8 +
                                 (local_1c44 - local_24d8) * local_24f0) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_b7c - local_24e0) +
                                 (local_b80 - local_24dc) * local_24f8 +
                                (local_1c44 - local_24d8) * local_24f0) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_b94 - local_24e0) +
                                (local_1c48 - local_24dc) * local_24f8 +
                               (local_1c44 - local_24d8) * local_24f0) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_bac - local_24e0) +
                               (local_bb0 - local_24dc) * local_24f8 +
                              (local_1c44 - local_24d8) * local_24f0) * 8)) *
                             local_1fa8.arr[0] * 0.25;
                local_bc4 = local_1c4c + 1;
                local_bc8 = local_1c48;
                local_bcc = local_1c44;
                local_bd0 = 1;
                local_bdc = local_1c4c + 1;
                local_be0 = local_1c48 + -1;
                local_be4 = local_1c44;
                local_be8 = 1;
                local_bf4 = local_1c4c + -1;
                local_bf8 = local_1c48;
                local_bfc = local_1c44;
                local_c00 = 1;
                local_c0c = local_1c4c + -1;
                local_c10 = local_1c48 + -1;
                local_c14 = local_1c44;
                local_c18 = 1;
                local_1c60 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_bc4 - local_24e0) +
                                  (local_1c48 - local_24dc) * local_24f8 +
                                  (local_1c44 - local_24d8) * local_24f0 + local_24e8) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_bdc - local_24e0) +
                                 (local_be0 - local_24dc) * local_24f8 +
                                 (local_1c44 - local_24d8) * local_24f0 + local_24e8) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_bf4 - local_24e0) +
                                (local_1c48 - local_24dc) * local_24f8 +
                                (local_1c44 - local_24d8) * local_24f0 + local_24e8) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_c0c - local_24e0) +
                               (local_c10 - local_24dc) * local_24f8 +
                               (local_1c44 - local_24d8) * local_24f0 + local_24e8) * 8)) *
                             local_1fa8.arr[0] * 0.25;
                local_c24 = local_1c4c;
                local_c28 = local_1c48;
                local_c2c = local_1c44 + 1;
                local_c30 = 1;
                local_c3c = local_1c4c;
                local_c40 = local_1c48 + -1;
                local_c44 = local_1c44 + 1;
                local_c48 = 1;
                local_c54 = local_1c4c;
                local_c58 = local_1c48;
                local_c5c = local_1c44 + -1;
                local_c60 = 1;
                local_c6c = local_1c4c;
                local_c70 = local_1c48 + -1;
                local_c74 = local_1c44 + -1;
                local_c78 = 1;
                local_1c68 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_1c4c - local_24e0) +
                                  (local_1c48 - local_24dc) * local_24f8 +
                                  (local_c2c - local_24d8) * local_24f0 + local_24e8) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_1c4c - local_24e0) +
                                 (local_c40 - local_24dc) * local_24f8 +
                                 (local_c44 - local_24d8) * local_24f0 + local_24e8) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_1c4c - local_24e0) +
                                (local_1c48 - local_24dc) * local_24f8 +
                                (local_c5c - local_24d8) * local_24f0 + local_24e8) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_1c4c - local_24e0) +
                               (local_c70 - local_24dc) * local_24f8 +
                               (local_c74 - local_24d8) * local_24f0 + local_24e8) * 8)) *
                             local_1fa8.arr[2] * 0.25;
                local_c84 = local_1c4c;
                local_c88 = local_1c48;
                local_c8c = local_1c44 + 1;
                local_c90 = 2;
                local_c9c = local_1c4c;
                local_ca0 = local_1c48 + -1;
                local_ca4 = local_1c44 + 1;
                local_ca8 = 2;
                local_cb4 = local_1c4c;
                local_cb8 = local_1c48;
                local_cbc = local_1c44 + -1;
                local_cc0 = 2;
                local_ccc = local_1c4c;
                local_cd0 = local_1c48 + -1;
                local_cd4 = local_1c44 + -1;
                local_cd8 = 2;
                local_1c70 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_1c4c - local_24e0) +
                                  (local_1c48 - local_24dc) * local_24f8 +
                                  (local_c8c - local_24d8) * local_24f0 + local_24e8 * 2) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_1c4c - local_24e0) +
                                 (local_ca0 - local_24dc) * local_24f8 +
                                 (local_ca4 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_1c4c - local_24e0) +
                                (local_1c48 - local_24dc) * local_24f8 +
                                (local_cbc - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_1c4c - local_24e0) +
                               (local_cd0 - local_24dc) * local_24f8 +
                               (local_cd4 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                             local_1fa8.arr[2] * 0.25;
                local_1c78 = local_1c58 + local_1c70;
                local_294 = local_1c4c;
                local_298 = local_1c48;
                local_29c = local_1c44;
                local_1c80 = *(double *)
                              (local_2640 +
                              ((long)(local_1c4c - local_2620) +
                               (local_1c48 - local_261c) * local_2638 +
                              (local_1c44 - local_2618) * local_2630) * 8);
                local_ce4 = local_1c4c;
                local_ce8 = local_1c48;
                local_cec = local_1c44;
                local_cf0 = 1;
                local_1c88 = (*(double *)
                               (local_2580 +
                               ((long)(local_1c4c - local_2560) +
                                (local_1c48 - local_255c) * local_2578 +
                                (local_1c44 - local_2558) * local_2570 + local_2568) * 8) -
                             local_1c80) * 0.75;
                local_cfc = local_1c4c;
                local_d00 = local_1c48;
                local_d04 = local_1c44;
                local_d08 = 0;
                local_1c90 = *(double *)
                              (local_2580 +
                              ((long)(local_1c4c - local_2560) +
                               (local_1c48 - local_255c) * local_2578 +
                              (local_1c44 - local_2558) * local_2570) * 8);
                local_1b2c = local_1c4c;
                local_1b30 = local_1c48;
                local_1b34 = local_1c44;
                local_1b38 = 0;
                *(double *)
                 (local_2480 +
                 ((long)(local_1c4c - local_2460) + (local_1c48 - local_245c) * local_2478 +
                 (local_1c44 - local_2458) * local_2470) * 8) = -local_1c90 * local_1c60;
                local_1b44 = local_1c4c;
                local_1b48 = local_1c48;
                local_1b4c = local_1c44;
                local_1b50 = 1;
                *(double *)
                 (local_2480 +
                 ((long)(local_1c4c - local_2460) + (local_1c48 - local_245c) * local_2478 +
                  (local_1c44 - local_2458) * local_2470 + local_2468) * 8) =
                     -local_1c88 * local_1c78 * -0.6666666666666666 + -(local_1c80 * local_1c78);
                local_1b5c = local_1c4c;
                local_1b60 = local_1c48;
                local_1b64 = local_1c44;
                local_1b68 = 2;
                *(double *)
                 (local_2480 +
                 ((long)(local_1c4c - local_2460) + (local_1c48 - local_245c) * local_2478 +
                  (local_1c44 - local_2458) * local_2470 + local_2468 * 2) * 8) =
                     -local_1c90 * local_1c68;
                local_1b58 = local_1bc8;
                local_1b40 = local_1bc8;
                local_1b28 = local_1bc8;
                local_cf8 = local_1bd8;
                local_ce0 = local_1bd8;
                local_cc8 = local_1bd0;
                local_cb0 = local_1bd0;
                local_c98 = local_1bd0;
                local_c80 = local_1bd0;
                local_c68 = local_1bd0;
                local_c50 = local_1bd0;
                local_c38 = local_1bd0;
                local_c20 = local_1bd0;
                local_c08 = local_1bd0;
                local_bf0 = local_1bd0;
                local_bd8 = local_1bd0;
                local_bc0 = local_1bd0;
                local_ba8 = local_1bd0;
                local_b90 = local_1bd0;
                local_b78 = local_1bd0;
                local_b60 = local_1bd0;
                local_290 = local_1be0;
                iVar2 = local_1c4c + 1;
              }
              iVar2 = local_1c48 + 1;
            }
          }
          local_1bc0 = &local_277c;
          local_1ba8 = &local_277c;
          local_1b80 = &local_277c;
          local_7f0 = &local_277c;
          local_7e0 = &local_277c;
          local_7d0 = &local_277c;
          local_5c0 = local_1be8;
          local_5b0 = local_1be8;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_2748);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffd320);
        local_2788 = local_27b0;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_27c8,&local_27e0), bVar3) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_27fc,&local_27c8);
          local_1a58 = &local_24c0;
          local_1a60 = &local_2500;
          local_1a68 = &local_25c0;
          local_1a70 = &local_2680;
          local_1a78 = &local_1fa8;
          local_5d4 = 0;
          local_5e4 = 1;
          local_834 = 0;
          local_844 = 1;
          local_854 = 2;
          local_860 = &local_27fc.bigend;
          local_864 = 0;
          local_870 = &local_27fc.bigend;
          local_874 = 1;
          local_880 = &local_27fc.bigend;
          local_884 = 2;
          local_1ad0 = 0x3fe5555555555555;
          for (local_1ad4 = local_27fc.smallend.vect[2]; iVar2 = local_27fc.smallend.vect[1],
              local_1ad4 <= local_27fc.bigend.vect[2]; local_1ad4 = local_1ad4 + 1) {
            while (local_1ad8 = iVar2, iVar2 = local_27fc.smallend.vect[0],
                  local_1ad8 <= local_27fc.bigend.vect[1]) {
              while (local_1adc = iVar2, local_1adc <= local_27fc.bigend.vect[0]) {
                local_d14 = local_1adc + 1;
                local_d18 = local_1ad8;
                local_d1c = local_1ad4;
                local_d20 = 0;
                local_d2c = local_1adc + 1;
                local_d30 = local_1ad8;
                local_d34 = local_1ad4 + -1;
                local_d38 = 0;
                local_d44 = local_1adc + -1;
                local_d48 = local_1ad8;
                local_d4c = local_1ad4;
                local_d50 = 0;
                local_d5c = local_1adc + -1;
                local_d60 = local_1ad8;
                local_d64 = local_1ad4 + -1;
                local_d68 = 0;
                local_1ae8 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_d14 - local_24e0) +
                                  (local_1ad8 - local_24dc) * local_24f8 +
                                 (local_1ad4 - local_24d8) * local_24f0) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_d2c - local_24e0) +
                                 (local_1ad8 - local_24dc) * local_24f8 +
                                (local_d34 - local_24d8) * local_24f0) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_d44 - local_24e0) +
                                (local_1ad8 - local_24dc) * local_24f8 +
                               (local_1ad4 - local_24d8) * local_24f0) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_d5c - local_24e0) +
                               (local_1ad8 - local_24dc) * local_24f8 +
                              (local_d64 - local_24d8) * local_24f0) * 8)) *
                             local_1fa8.arr[0] * 0.25;
                local_d74 = local_1adc + 1;
                local_d78 = local_1ad8;
                local_d7c = local_1ad4;
                local_d80 = 2;
                local_d8c = local_1adc + 1;
                local_d90 = local_1ad8;
                local_d94 = local_1ad4 + -1;
                local_d98 = 2;
                local_da4 = local_1adc + -1;
                local_da8 = local_1ad8;
                local_dac = local_1ad4;
                local_db0 = 2;
                local_dbc = local_1adc + -1;
                local_dc0 = local_1ad8;
                local_dc4 = local_1ad4 + -1;
                local_dc8 = 2;
                local_1af0 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_d74 - local_24e0) +
                                  (local_1ad8 - local_24dc) * local_24f8 +
                                  (local_1ad4 - local_24d8) * local_24f0 + local_24e8 * 2) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_d8c - local_24e0) +
                                 (local_1ad8 - local_24dc) * local_24f8 +
                                 (local_d94 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_da4 - local_24e0) +
                                (local_1ad8 - local_24dc) * local_24f8 +
                                (local_1ad4 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_dbc - local_24e0) +
                               (local_1ad8 - local_24dc) * local_24f8 +
                               (local_dc4 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                             local_1fa8.arr[0] * 0.25;
                local_dd4 = local_1adc;
                local_dd8 = local_1ad8 + 1;
                local_ddc = local_1ad4;
                local_de0 = 1;
                local_dec = local_1adc;
                local_df0 = local_1ad8 + 1;
                local_df4 = local_1ad4 + -1;
                local_df8 = 1;
                local_e04 = local_1adc;
                local_e08 = local_1ad8 + -1;
                local_e0c = local_1ad4;
                local_e10 = 1;
                local_e1c = local_1adc;
                local_e20 = local_1ad8 + -1;
                local_e24 = local_1ad4 + -1;
                local_e28 = 1;
                local_1af8 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_1adc - local_24e0) +
                                  (local_dd8 - local_24dc) * local_24f8 +
                                  (local_1ad4 - local_24d8) * local_24f0 + local_24e8) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_1adc - local_24e0) +
                                 (local_df0 - local_24dc) * local_24f8 +
                                 (local_df4 - local_24d8) * local_24f0 + local_24e8) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_1adc - local_24e0) +
                                (local_e08 - local_24dc) * local_24f8 +
                                (local_1ad4 - local_24d8) * local_24f0 + local_24e8) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_1adc - local_24e0) +
                               (local_e20 - local_24dc) * local_24f8 +
                               (local_e24 - local_24d8) * local_24f0 + local_24e8) * 8)) *
                             local_1fa8.arr[1] * 0.25;
                local_e34 = local_1adc;
                local_e38 = local_1ad8 + 1;
                local_e3c = local_1ad4;
                local_e40 = 2;
                local_e4c = local_1adc;
                local_e50 = local_1ad8 + 1;
                local_e54 = local_1ad4 + -1;
                local_e58 = 2;
                local_e64 = local_1adc;
                local_e68 = local_1ad8 + -1;
                local_e6c = local_1ad4;
                local_e70 = 2;
                local_e7c = local_1adc;
                local_e80 = local_1ad8 + -1;
                local_e84 = local_1ad4 + -1;
                local_e88 = 2;
                local_1b00 = (((*(double *)
                                 (local_2500 +
                                 ((long)(local_1adc - local_24e0) +
                                  (local_e38 - local_24dc) * local_24f8 +
                                  (local_1ad4 - local_24d8) * local_24f0 + local_24e8 * 2) * 8) +
                               *(double *)
                                (local_2500 +
                                ((long)(local_1adc - local_24e0) +
                                 (local_e50 - local_24dc) * local_24f8 +
                                 (local_e54 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) -
                              *(double *)
                               (local_2500 +
                               ((long)(local_1adc - local_24e0) +
                                (local_e68 - local_24dc) * local_24f8 +
                                (local_1ad4 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) -
                             *(double *)
                              (local_2500 +
                              ((long)(local_1adc - local_24e0) +
                               (local_e80 - local_24dc) * local_24f8 +
                               (local_e84 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                             local_1fa8.arr[1] * 0.25;
                local_1b08 = local_1ae8 + local_1af8;
                local_2ac = local_1adc;
                local_2b0 = local_1ad8;
                local_2b4 = local_1ad4;
                local_1b10 = *(double *)
                              (local_2680 +
                              ((long)(local_1adc - local_2660) +
                               (local_1ad8 - local_265c) * local_2678 +
                              (local_1ad4 - local_2658) * local_2670) * 8);
                local_e94 = local_1adc;
                local_e98 = local_1ad8;
                local_e9c = local_1ad4;
                local_ea0 = 2;
                local_1b18 = (*(double *)
                               (local_25c0 +
                               ((long)(local_1adc - local_25a0) +
                                (local_1ad8 - local_259c) * local_25b8 +
                                (local_1ad4 - local_2598) * local_25b0 + local_25a8 * 2) * 8) -
                             local_1b10) * 0.75;
                local_eac = local_1adc;
                local_eb0 = local_1ad8;
                local_eb4 = local_1ad4;
                local_eb8 = 0;
                local_1b20 = *(double *)
                              (local_25c0 +
                              ((long)(local_1adc - local_25a0) +
                               (local_1ad8 - local_259c) * local_25b8 +
                              (local_1ad4 - local_2598) * local_25b0) * 8);
                local_19bc = local_1adc;
                local_19c0 = local_1ad8;
                local_19c4 = local_1ad4;
                local_19c8 = 0;
                *(double *)
                 (local_24c0 +
                 ((long)(local_1adc - local_24a0) + (local_1ad8 - local_249c) * local_24b8 +
                 (local_1ad4 - local_2498) * local_24b0) * 8) = -local_1b20 * local_1af0;
                local_19d4 = local_1adc;
                local_19d8 = local_1ad8;
                local_19dc = local_1ad4;
                local_19e0 = 1;
                *(double *)
                 (local_24c0 +
                 ((long)(local_1adc - local_24a0) + (local_1ad8 - local_249c) * local_24b8 +
                  (local_1ad4 - local_2498) * local_24b0 + local_24a8) * 8) =
                     -local_1b20 * local_1b00;
                local_19ec = local_1adc;
                local_19f0 = local_1ad8;
                local_19f4 = local_1ad4;
                local_19f8 = 2;
                *(double *)
                 (local_24c0 +
                 ((long)(local_1adc - local_24a0) + (local_1ad8 - local_249c) * local_24b8 +
                  (local_1ad4 - local_2498) * local_24b0 + local_24a8 * 2) * 8) =
                     -local_1b18 * local_1b08 * -0.6666666666666666 + -(local_1b10 * local_1b08);
                local_19e8 = local_1a58;
                local_19d0 = local_1a58;
                local_19b8 = local_1a58;
                local_ea8 = local_1a68;
                local_e90 = local_1a68;
                local_e78 = local_1a60;
                local_e60 = local_1a60;
                local_e48 = local_1a60;
                local_e30 = local_1a60;
                local_e18 = local_1a60;
                local_e00 = local_1a60;
                local_de8 = local_1a60;
                local_dd0 = local_1a60;
                local_db8 = local_1a60;
                local_da0 = local_1a60;
                local_d88 = local_1a60;
                local_d70 = local_1a60;
                local_d58 = local_1a60;
                local_d40 = local_1a60;
                local_d28 = local_1a60;
                local_d10 = local_1a60;
                local_2a8 = local_1a70;
                iVar2 = local_1adc + 1;
              }
              iVar2 = local_1ad8 + 1;
            }
          }
          local_1a50 = &local_27fc;
          local_1a38 = &local_27fc;
          local_1a10 = &local_27fc;
          local_850 = &local_27fc;
          local_840 = &local_27fc;
          local_830 = &local_27fc;
          local_5e0 = local_1a78;
          local_5d0 = local_1a78;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_27c8);
        }
      }
      else {
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd320,
                   (size_type)in_stack_ffffffffffffd318);
        MultiCutFab::const_array(in_stack_ffffffffffffd320,in_stack_ffffffffffffd318);
        local_2808 = local_2848;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd320,
                   (size_type)in_stack_ffffffffffffd318);
        MultiCutFab::const_array(in_stack_ffffffffffffd320,in_stack_ffffffffffffd318);
        local_2850 = local_2890;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffd320,
                   (size_type)in_stack_ffffffffffffd318);
        MultiCutFab::const_array(in_stack_ffffffffffffd320,in_stack_ffffffffffffd318);
        local_2898 = local_28d8;
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (in_stack_ffffffffffffd328,(MFIter *)in_stack_ffffffffffffd320);
        local_28e0 = local_2920;
        Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffd320);
        local_2928 = local_2950;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_2968,&local_2980), bVar3) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_299c,&local_2968);
          local_18a8 = &local_2440;
          local_18b0 = &local_2500;
          local_18b8 = &local_2540;
          local_18c0 = &local_2600;
          local_18c8 = local_2808;
          local_18d0 = local_28e0;
          local_18d8 = &local_1fa8;
          local_5f4 = 1;
          local_604 = 2;
          local_894 = 0;
          local_8a4 = 1;
          local_8b4 = 2;
          local_8c0 = &local_299c.bigend;
          local_8c4 = 0;
          local_8d0 = &local_299c.bigend;
          local_8d4 = 1;
          local_8e0 = &local_299c.bigend;
          local_8e4 = 2;
          local_1930 = 0x3fe5555555555555;
          for (local_1934 = local_299c.smallend.vect[2]; iVar2 = local_299c.smallend.vect[1],
              local_1934 <= local_299c.bigend.vect[2]; local_1934 = local_1934 + 1) {
            while (local_1938 = iVar2, iVar2 = local_299c.smallend.vect[0],
                  local_1938 <= local_299c.bigend.vect[1]) {
              while (local_193c = iVar2, local_193c <= local_299c.bigend.vect[0]) {
                local_2c0 = local_2808;
                local_2c4 = local_193c;
                local_2c8 = local_1938;
                local_2cc = local_1934;
                dVar1 = *(double *)
                         (*local_2808 +
                         ((long)(local_193c - (int)local_2808[4]) +
                          (long)(local_1938 - *(int *)((long)local_2808 + 0x24)) * local_2808[1] +
                         (long)(local_1934 - (int)local_2808[5]) * local_2808[2]) * 8);
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  local_350 = local_28e0;
                  local_354 = local_193c;
                  local_358 = local_1938;
                  local_35c = local_1934;
                  local_38 = (uint *)(*local_28e0 +
                                     ((long)(local_193c - (int)local_28e0[4]) +
                                      (long)(local_1938 - *(int *)((long)local_28e0 + 0x24)) *
                                      local_28e0[1] +
                                     (long)(local_1934 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_3c = 0;
                  local_40 = 1;
                  local_44 = 0;
                  local_48 = 0x15;
                  local_1940 = local_1938 + (uint)((*local_38 & 0x200000) != 0);
                  local_368 = local_28e0;
                  local_36c = local_193c;
                  local_370 = local_1938;
                  local_374 = local_1934;
                  local_50 = (uint *)(*local_28e0 +
                                     ((long)(local_193c - (int)local_28e0[4]) +
                                      (long)(local_1938 - *(int *)((long)local_28e0 + 0x24)) *
                                      local_28e0[1] +
                                     (long)(local_1934 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_54 = 0;
                  local_58 = 0xffffffff;
                  local_5c = 0;
                  local_60 = 0xf;
                  local_1944 = local_1938 - (uint)((*local_50 & 0x8000) != 0);
                  local_384 = local_193c + -1;
                  local_380 = local_28e0;
                  local_388 = local_1938;
                  local_38c = local_1934;
                  local_68 = (uint *)(*local_28e0 +
                                     ((long)(local_384 - (int)local_28e0[4]) +
                                      (long)(local_1938 - *(int *)((long)local_28e0 + 0x24)) *
                                      local_28e0[1] +
                                     (long)(local_1934 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_6c = 0;
                  local_70 = 1;
                  local_74 = 0;
                  local_78 = 0x15;
                  local_1948 = local_1938 + (uint)((*local_68 & 0x200000) != 0);
                  local_39c = local_193c + -1;
                  local_398 = local_28e0;
                  local_3a0 = local_1938;
                  local_3a4 = local_1934;
                  local_80 = (uint *)(*local_28e0 +
                                     ((long)(local_39c - (int)local_28e0[4]) +
                                      (long)(local_1938 - *(int *)((long)local_28e0 + 0x24)) *
                                      local_28e0[1] +
                                     (long)(local_1934 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_84 = 0;
                  local_88 = 0xffffffff;
                  local_8c = 0;
                  local_90 = 0xf;
                  local_194c = local_1938 - (uint)((*local_80 & 0x8000) != 0);
                  local_4 = local_1940 - local_1944;
                  if (local_4 == 2) {
                    local_2b40 = 0.5;
                  }
                  else {
                    local_2b48 = 1.0;
                    if (local_4 != 1) {
                      local_2b48 = 0.0;
                    }
                    local_2b40 = local_2b48;
                  }
                  local_8 = local_1948 - local_194c;
                  if (local_8 == 2) {
                    local_2b60 = 0.5;
                  }
                  else {
                    local_2b68 = 1.0;
                    if (local_8 != 1) {
                      local_2b68 = 0.0;
                    }
                    local_2b60 = local_2b68;
                  }
                  local_ec4 = local_193c;
                  local_ecc = local_1934;
                  local_ed0 = 0;
                  local_edc = local_193c;
                  local_ee4 = local_1934;
                  local_ee8 = 0;
                  local_ef4 = local_193c + -1;
                  local_efc = local_1934;
                  local_f00 = 0;
                  local_f0c = local_193c + -1;
                  local_f14 = local_1934;
                  local_f18 = 0;
                  local_1968 = local_1fa8.arr[1] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_193c - local_24e0) +
                                   (local_1940 - local_24dc) * local_24f8 +
                                  (local_1934 - local_24d8) * local_24f0) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_193c - local_24e0) +
                                  (local_1944 - local_24dc) * local_24f8 +
                                 (local_1934 - local_24d8) * local_24f0) * 8)) * local_2b40 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_ef4 - local_24e0) +
                                  (local_1948 - local_24dc) * local_24f8 +
                                 (local_1934 - local_24d8) * local_24f0) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_f0c - local_24e0) +
                                 (local_194c - local_24dc) * local_24f8 +
                                (local_1934 - local_24d8) * local_24f0) * 8)) * local_2b60);
                  local_f24 = local_193c;
                  local_f2c = local_1934;
                  local_f30 = 1;
                  local_f3c = local_193c;
                  local_f44 = local_1934;
                  local_f48 = 1;
                  local_f54 = local_193c + -1;
                  local_f5c = local_1934;
                  local_f60 = 1;
                  local_f6c = local_193c + -1;
                  local_f74 = local_1934;
                  local_f78 = 1;
                  local_1970 = local_1fa8.arr[1] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_193c - local_24e0) +
                                   (local_1940 - local_24dc) * local_24f8 +
                                   (local_1934 - local_24d8) * local_24f0 + local_24e8) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_193c - local_24e0) +
                                  (local_1944 - local_24dc) * local_24f8 +
                                  (local_1934 - local_24d8) * local_24f0 + local_24e8) * 8)) *
                                local_2b40 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_f54 - local_24e0) +
                                  (local_1948 - local_24dc) * local_24f8 +
                                  (local_1934 - local_24d8) * local_24f0 + local_24e8) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_f6c - local_24e0) +
                                 (local_194c - local_24dc) * local_24f8 +
                                 (local_1934 - local_24d8) * local_24f0 + local_24e8) * 8)) *
                               local_2b60);
                  local_3b0 = local_28e0;
                  local_3b4 = local_193c;
                  local_3b8 = local_1938;
                  local_3bc = local_1934;
                  local_98 = (uint *)(*local_28e0 +
                                     ((long)(local_193c - (int)local_28e0[4]) +
                                      (long)(local_1938 - *(int *)((long)local_28e0 + 0x24)) *
                                      local_28e0[1] +
                                     (long)(local_1934 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_9c = 0;
                  local_a0 = 0;
                  local_a4 = 1;
                  local_a8 = 0x1b;
                  local_1974 = local_1934 + (uint)((*local_98 & 0x8000000) != 0);
                  local_3c8 = local_28e0;
                  local_3cc = local_193c;
                  local_3d0 = local_1938;
                  local_3d4 = local_1934;
                  local_b0 = (uint *)(*local_28e0 +
                                     ((long)(local_193c - (int)local_28e0[4]) +
                                      (long)(local_1938 - *(int *)((long)local_28e0 + 0x24)) *
                                      local_28e0[1] +
                                     (long)(local_1934 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_b4 = 0;
                  local_b8 = 0;
                  local_bc = 0xffffffff;
                  local_c0 = 9;
                  local_1978 = local_1934 - (uint)((*local_b0 & 0x200) != 0);
                  local_3e4 = local_193c + -1;
                  local_3e0 = local_28e0;
                  local_3e8 = local_1938;
                  local_3ec = local_1934;
                  local_c8 = (uint *)(*local_28e0 +
                                     ((long)(local_3e4 - (int)local_28e0[4]) +
                                      (long)(local_1938 - *(int *)((long)local_28e0 + 0x24)) *
                                      local_28e0[1] +
                                     (long)(local_1934 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_cc = 0;
                  local_d0 = 0;
                  local_d4 = 1;
                  local_d8 = 0x1b;
                  local_197c = local_1934 + (uint)((*local_c8 & 0x8000000) != 0);
                  local_3fc = local_193c + -1;
                  local_3f8 = local_28e0;
                  local_400 = local_1938;
                  local_404 = local_1934;
                  local_e0 = (uint *)(*local_28e0 +
                                     ((long)(local_3fc - (int)local_28e0[4]) +
                                      (long)(local_1938 - *(int *)((long)local_28e0 + 0x24)) *
                                      local_28e0[1] +
                                     (long)(local_1934 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_e4 = 0;
                  local_e8 = 0;
                  local_ec = 0xffffffff;
                  local_f0 = 9;
                  local_1980 = local_1934 - (uint)((*local_e0 & 0x200) != 0);
                  local_c = local_1974 - local_1978;
                  if (local_c == 2) {
                    local_2b90 = 0.5;
                  }
                  else {
                    local_2b98 = 1.0;
                    if (local_c != 1) {
                      local_2b98 = 0.0;
                    }
                    local_2b90 = local_2b98;
                  }
                  local_1958 = local_2b90;
                  local_10 = local_197c - local_1980;
                  if (local_10 == 2) {
                    local_2bb0 = (EBCellFlagFab *)0x3fe0000000000000;
                  }
                  else {
                    in_stack_ffffffffffffd440 = (Box *)0x0;
                    in_stack_ffffffffffffd448 = (EBCellFlagFab *)&DAT_3ff0000000000000;
                    local_2bb0 = in_stack_ffffffffffffd448;
                    if (local_10 != 1) {
                      in_stack_ffffffffffffd448 = (EBCellFlagFab *)0x0;
                      local_2bb0 = in_stack_ffffffffffffd448;
                    }
                  }
                  local_1960 = local_2bb0;
                  local_f84 = local_193c;
                  local_f88 = local_1938;
                  local_f90 = 0;
                  local_f9c = local_193c;
                  local_fa0 = local_1938;
                  local_fa8 = 0;
                  local_fb4 = local_193c + -1;
                  local_fb8 = local_1938;
                  local_fc0 = 0;
                  local_fcc = local_193c + -1;
                  local_fd0 = local_1938;
                  local_fd8 = 0;
                  local_1988 = local_1fa8.arr[2] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_193c - local_24e0) +
                                   (local_1938 - local_24dc) * local_24f8 +
                                  (local_1974 - local_24d8) * local_24f0) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_193c - local_24e0) +
                                  (local_1938 - local_24dc) * local_24f8 +
                                 (local_1978 - local_24d8) * local_24f0) * 8)) * local_2b90 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_fb4 - local_24e0) +
                                  (local_1938 - local_24dc) * local_24f8 +
                                 (local_197c - local_24d8) * local_24f0) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_fcc - local_24e0) +
                                 (local_1938 - local_24dc) * local_24f8 +
                                (local_1980 - local_24d8) * local_24f0) * 8)) * (double)local_2bb0);
                  local_fe4 = local_193c;
                  local_fe8 = local_1938;
                  local_ff0 = 2;
                  local_ffc = local_193c;
                  local_1000 = local_1938;
                  local_1008 = 2;
                  local_1014 = local_193c + -1;
                  local_1018 = local_1938;
                  local_1020 = 2;
                  local_102c = local_193c + -1;
                  local_1030 = local_1938;
                  local_1038 = 2;
                  local_1990 = local_1fa8.arr[2] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_193c - local_24e0) +
                                   (local_1938 - local_24dc) * local_24f8 +
                                   (local_1974 - local_24d8) * local_24f0 + local_24e8 * 2) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_193c - local_24e0) +
                                  (local_1938 - local_24dc) * local_24f8 +
                                  (local_1978 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                                local_2b90 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_1014 - local_24e0) +
                                  (local_1938 - local_24dc) * local_24f8 +
                                  (local_197c - local_24d8) * local_24f0 + local_24e8 * 2) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_102c - local_24e0) +
                                 (local_1938 - local_24dc) * local_24f8 +
                                 (local_1980 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                               (double)local_2bb0);
                  local_1998 = local_1970 + local_1990;
                  local_2dc = local_193c;
                  local_2e0 = local_1938;
                  local_2e4 = local_1934;
                  local_19a0 = *(double *)
                                (local_2600 +
                                ((long)(local_193c - local_25e0) +
                                 (local_1938 - local_25dc) * local_25f8 +
                                (local_1934 - local_25d8) * local_25f0) * 8);
                  local_1044 = local_193c;
                  local_1048 = local_1938;
                  local_104c = local_1934;
                  local_1050 = 0;
                  local_19a8 = (*(double *)
                                 (local_2540 +
                                 ((long)(local_193c - local_2520) +
                                  (local_1938 - local_251c) * local_2538 +
                                 (local_1934 - local_2518) * local_2530) * 8) - local_19a0) * 0.75;
                  local_105c = local_193c;
                  local_1060 = local_1938;
                  local_1064 = local_1934;
                  local_1068 = 1;
                  local_19b0 = *(double *)
                                (local_2540 +
                                ((long)(local_193c - local_2520) +
                                 (local_1938 - local_251c) * local_2538 +
                                 (local_1934 - local_2518) * local_2530 + local_2528) * 8);
                  local_180c = local_193c;
                  local_1810 = local_1938;
                  local_1814 = local_1934;
                  local_1818 = 0;
                  *(double *)
                   (local_2440 +
                   ((long)(local_193c - local_2420) + (local_1938 - local_241c) * local_2438 +
                   (local_1934 - local_2418) * local_2430) * 8) =
                       -local_19a8 * local_1998 * -0.6666666666666666 + -(local_19a0 * local_1998);
                  local_1824 = local_193c;
                  local_1828 = local_1938;
                  local_182c = local_1934;
                  local_1830 = 1;
                  *(double *)
                   (local_2440 +
                   ((long)(local_193c - local_2420) + (local_1938 - local_241c) * local_2438 +
                    (local_1934 - local_2418) * local_2430 + local_2428) * 8) =
                       -local_19b0 * local_1968;
                  local_183c = local_193c;
                  local_1840 = local_1938;
                  local_1844 = local_1934;
                  local_1848 = 2;
                  *(double *)
                   (local_2440 +
                   ((long)(local_193c - local_2420) + (local_1938 - local_241c) * local_2438 +
                    (local_1934 - local_2418) * local_2430 + local_2428 * 2) * 8) =
                       -local_19b0 * local_1988;
                  local_1838 = local_18a8;
                  local_1820 = local_18a8;
                  local_1808 = local_18a8;
                  local_1058 = local_18b8;
                  local_1040 = local_18b8;
                  local_1034 = local_1980;
                  local_1028 = local_18b0;
                  local_101c = local_197c;
                  local_1010 = local_18b0;
                  local_1004 = local_1978;
                  local_ff8 = local_18b0;
                  local_fec = local_1974;
                  local_fe0 = local_18b0;
                  local_fd4 = local_1980;
                  local_fc8 = local_18b0;
                  local_fbc = local_197c;
                  local_fb0 = local_18b0;
                  local_fa4 = local_1978;
                  local_f98 = local_18b0;
                  local_f8c = local_1974;
                  local_f80 = local_18b0;
                  local_f70 = local_194c;
                  local_f68 = local_18b0;
                  local_f58 = local_1948;
                  local_f50 = local_18b0;
                  local_f40 = local_1944;
                  local_f38 = local_18b0;
                  local_f28 = local_1940;
                  local_f20 = local_18b0;
                  local_f10 = local_194c;
                  local_f08 = local_18b0;
                  local_ef8 = local_1948;
                  local_ef0 = local_18b0;
                  local_ee0 = local_1944;
                  local_ed8 = local_18b0;
                  local_ec8 = local_1940;
                  local_ec0 = local_18b0;
                  local_2d8 = local_18c0;
                }
                else {
                  local_17c4 = local_193c;
                  local_17c8 = local_1938;
                  local_17cc = local_1934;
                  local_17d0 = 0;
                  *(undefined8 *)
                   (local_2440 +
                   ((long)(local_193c - local_2420) + (local_1938 - local_241c) * local_2438 +
                   (local_1934 - local_2418) * local_2430) * 8) = 0;
                  local_17dc = local_193c;
                  local_17e0 = local_1938;
                  local_17e4 = local_1934;
                  local_17e8 = 1;
                  *(undefined8 *)
                   (local_2440 +
                   ((long)(local_193c - local_2420) + (local_1938 - local_241c) * local_2438 +
                    (local_1934 - local_2418) * local_2430 + local_2428) * 8) = 0;
                  local_17f4 = local_193c;
                  local_17f8 = local_1938;
                  local_17fc = local_1934;
                  local_1800 = 2;
                  *(undefined8 *)
                   (local_2440 +
                   ((long)(local_193c - local_2420) + (local_1938 - local_241c) * local_2438 +
                    (local_1934 - local_2418) * local_2430 + local_2428 * 2) * 8) = 0;
                  local_17f0 = local_18a8;
                  local_17d8 = local_18a8;
                  local_17c0 = local_18a8;
                }
                iVar2 = local_193c + 1;
              }
              iVar2 = local_1938 + 1;
            }
          }
          local_18a0 = &local_299c;
          local_1888 = &local_299c;
          local_1860 = &local_299c;
          local_8b0 = &local_299c;
          local_8a0 = &local_299c;
          local_890 = &local_299c;
          local_600 = local_18d8;
          local_5f0 = local_18d8;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_2968);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffd320);
        local_29a8 = local_29d0;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_29e8,&local_2a00), bVar3) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_2a1c,&local_29e8);
          local_16b0 = &local_2480;
          local_16b8 = &local_2500;
          local_16c0 = &local_2580;
          local_16c8 = &local_2640;
          local_16d0 = local_2850;
          local_16d8 = local_28e0;
          local_16e0 = &local_1fa8;
          local_614 = 0;
          local_624 = 2;
          local_8f4 = 0;
          local_904 = 1;
          local_914 = 2;
          local_920 = &local_2a1c.bigend;
          local_924 = 0;
          local_930 = &local_2a1c.bigend;
          local_934 = 1;
          local_940 = &local_2a1c.bigend;
          local_944 = 2;
          local_1738 = 0x3fe5555555555555;
          for (local_173c = local_2a1c.smallend.vect[2]; iVar2 = local_2a1c.smallend.vect[1],
              local_173c <= local_2a1c.bigend.vect[2]; local_173c = local_173c + 1) {
            while (local_1740 = iVar2, iVar2 = local_2a1c.smallend.vect[0],
                  local_1740 <= local_2a1c.bigend.vect[1]) {
              while (local_1744 = iVar2, local_1744 <= local_2a1c.bigend.vect[0]) {
                local_2f0 = local_2850;
                local_2f4 = local_1744;
                local_2f8 = local_1740;
                local_2fc = local_173c;
                dVar1 = *(double *)
                         (*local_2850 +
                         ((long)(local_1744 - (int)local_2850[4]) +
                          (long)(local_1740 - *(int *)((long)local_2850 + 0x24)) * local_2850[1] +
                         (long)(local_173c - (int)local_2850[5]) * local_2850[2]) * 8);
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  local_410 = local_28e0;
                  local_414 = local_1744;
                  local_418 = local_1740;
                  local_41c = local_173c;
                  local_f8 = (uint *)(*local_28e0 +
                                     ((long)(local_1744 - (int)local_28e0[4]) +
                                      (long)(local_1740 - *(int *)((long)local_28e0 + 0x24)) *
                                      local_28e0[1] +
                                     (long)(local_173c - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_fc = 1;
                  local_100 = 0;
                  local_104 = 0;
                  local_108 = 0x13;
                  local_1748 = local_1744 + (uint)((*local_f8 & 0x80000) != 0);
                  local_428 = local_28e0;
                  local_42c = local_1744;
                  local_430 = local_1740;
                  local_434 = local_173c;
                  local_110 = (uint *)(*local_28e0 +
                                      ((long)(local_1744 - (int)local_28e0[4]) +
                                       (long)(local_1740 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_173c - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_114 = 0xffffffff;
                  local_118 = 0;
                  local_11c = 0;
                  local_120 = 0x11;
                  local_174c = local_1744 - (uint)((*local_110 & 0x20000) != 0);
                  local_448 = local_1740 + -1;
                  local_440 = local_28e0;
                  local_444 = local_1744;
                  local_44c = local_173c;
                  local_128 = (uint *)(*local_28e0 +
                                      ((long)(local_1744 - (int)local_28e0[4]) +
                                       (long)(local_448 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_173c - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_12c = 1;
                  local_130 = 0;
                  local_134 = 0;
                  local_138 = 0x13;
                  local_1750 = local_1744 + (uint)((*local_128 & 0x80000) != 0);
                  local_460 = local_1740 + -1;
                  local_458 = local_28e0;
                  local_45c = local_1744;
                  local_464 = local_173c;
                  local_140 = (uint *)(*local_28e0 +
                                      ((long)(local_1744 - (int)local_28e0[4]) +
                                       (long)(local_460 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_173c - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_144 = 0xffffffff;
                  local_148 = 0;
                  local_14c = 0;
                  local_150 = 0x11;
                  local_1754 = local_1744 - (uint)((*local_140 & 0x20000) != 0);
                  local_14 = local_1748 - local_174c;
                  if (local_14 == 2) {
                    local_2be8 = 0.5;
                  }
                  else {
                    local_2bf0 = 1.0;
                    if (local_14 != 1) {
                      local_2bf0 = 0.0;
                    }
                    local_2be8 = local_2bf0;
                  }
                  local_18 = local_1750 - local_1754;
                  if (local_18 == 2) {
                    local_2c00 = 0.5;
                  }
                  else {
                    local_2c08 = 1.0;
                    if (local_18 != 1) {
                      local_2c08 = 0.0;
                    }
                    local_2c00 = local_2c08;
                  }
                  local_1078 = local_1740;
                  local_107c = local_173c;
                  local_1080 = 0;
                  local_1090 = local_1740;
                  local_1094 = local_173c;
                  local_1098 = 0;
                  local_10a8 = local_1740 + -1;
                  local_10ac = local_173c;
                  local_10b0 = 0;
                  local_10c0 = local_1740 + -1;
                  local_10c4 = local_173c;
                  local_10c8 = 0;
                  local_1770 = local_1fa8.arr[0] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_1748 - local_24e0) +
                                   (local_1740 - local_24dc) * local_24f8 +
                                  (local_173c - local_24d8) * local_24f0) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_174c - local_24e0) +
                                  (local_1740 - local_24dc) * local_24f8 +
                                 (local_173c - local_24d8) * local_24f0) * 8)) * local_2be8 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_1750 - local_24e0) +
                                  (local_10a8 - local_24dc) * local_24f8 +
                                 (local_173c - local_24d8) * local_24f0) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_1754 - local_24e0) +
                                 (local_10c0 - local_24dc) * local_24f8 +
                                (local_173c - local_24d8) * local_24f0) * 8)) * local_2c00);
                  local_10d8 = local_1740;
                  local_10dc = local_173c;
                  local_10e0 = 1;
                  local_10f0 = local_1740;
                  local_10f4 = local_173c;
                  local_10f8 = 1;
                  local_1108 = local_1740 + -1;
                  local_110c = local_173c;
                  local_1110 = 1;
                  local_1120 = local_1740 + -1;
                  local_1124 = local_173c;
                  local_1128 = 1;
                  local_1778 = local_1fa8.arr[0] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_1748 - local_24e0) +
                                   (local_1740 - local_24dc) * local_24f8 +
                                   (local_173c - local_24d8) * local_24f0 + local_24e8) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_174c - local_24e0) +
                                  (local_1740 - local_24dc) * local_24f8 +
                                  (local_173c - local_24d8) * local_24f0 + local_24e8) * 8)) *
                                local_2be8 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_1750 - local_24e0) +
                                  (local_1108 - local_24dc) * local_24f8 +
                                  (local_173c - local_24d8) * local_24f0 + local_24e8) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_1754 - local_24e0) +
                                 (local_1120 - local_24dc) * local_24f8 +
                                 (local_173c - local_24d8) * local_24f0 + local_24e8) * 8)) *
                               local_2c00);
                  local_470 = local_28e0;
                  local_474 = local_1744;
                  local_478 = local_1740;
                  local_47c = local_173c;
                  local_158 = (uint *)(*local_28e0 +
                                      ((long)(local_1744 - (int)local_28e0[4]) +
                                       (long)(local_1740 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_173c - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_15c = 0;
                  local_160 = 0;
                  local_164 = 1;
                  local_168 = 0x1b;
                  local_177c = local_173c + (uint)((*local_158 & 0x8000000) != 0);
                  local_488 = local_28e0;
                  local_48c = local_1744;
                  local_490 = local_1740;
                  local_494 = local_173c;
                  local_170 = (uint *)(*local_28e0 +
                                      ((long)(local_1744 - (int)local_28e0[4]) +
                                       (long)(local_1740 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_173c - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_174 = 0;
                  local_178 = 0;
                  local_17c = 0xffffffff;
                  local_180 = 9;
                  local_1780 = local_173c - (uint)((*local_170 & 0x200) != 0);
                  local_4a8 = local_1740 + -1;
                  local_4a0 = local_28e0;
                  local_4a4 = local_1744;
                  local_4ac = local_173c;
                  local_188 = (uint *)(*local_28e0 +
                                      ((long)(local_1744 - (int)local_28e0[4]) +
                                       (long)(local_4a8 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_173c - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_18c = 0;
                  local_190 = 0;
                  local_194 = 1;
                  local_198 = 0x1b;
                  local_1784 = local_173c + (uint)((*local_188 & 0x8000000) != 0);
                  local_4c0 = local_1740 + -1;
                  local_4b8 = local_28e0;
                  local_4bc = local_1744;
                  local_4c4 = local_173c;
                  local_1a0 = (uint *)(*local_28e0 +
                                      ((long)(local_1744 - (int)local_28e0[4]) +
                                       (long)(local_4c0 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_173c - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_1a4 = 0;
                  local_1a8 = 0;
                  local_1ac = 0xffffffff;
                  local_1b0 = 9;
                  local_1788 = local_173c - (uint)((*local_1a0 & 0x200) != 0);
                  local_1c = local_177c - local_1780;
                  if (local_1c == 2) {
                    local_2c28 = 0.5;
                  }
                  else {
                    local_2c30 = 1.0;
                    if (local_1c != 1) {
                      local_2c30 = 0.0;
                    }
                    local_2c28 = local_2c30;
                  }
                  local_1760 = local_2c28;
                  local_20 = local_1784 - local_1788;
                  if (local_20 == 2) {
                    local_2c40 = 0.5;
                  }
                  else {
                    local_2c48 = 1.0;
                    if (local_20 != 1) {
                      local_2c48 = 0.0;
                    }
                    local_2c40 = local_2c48;
                  }
                  local_1768 = local_2c40;
                  local_1134 = local_1744;
                  local_1138 = local_1740;
                  local_1140 = 1;
                  local_114c = local_1744;
                  local_1150 = local_1740;
                  local_1158 = 1;
                  local_1168 = local_1740 + -1;
                  local_1164 = local_1744;
                  local_1170 = 1;
                  local_1180 = local_1740 + -1;
                  local_117c = local_1744;
                  local_1188 = 1;
                  local_1790 = local_1fa8.arr[2] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_1744 - local_24e0) +
                                   (local_1740 - local_24dc) * local_24f8 +
                                   (local_177c - local_24d8) * local_24f0 + local_24e8) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_1744 - local_24e0) +
                                  (local_1740 - local_24dc) * local_24f8 +
                                  (local_1780 - local_24d8) * local_24f0 + local_24e8) * 8)) *
                                local_2c28 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_1744 - local_24e0) +
                                  (local_1168 - local_24dc) * local_24f8 +
                                  (local_1784 - local_24d8) * local_24f0 + local_24e8) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_1744 - local_24e0) +
                                 (local_1180 - local_24dc) * local_24f8 +
                                 (local_1788 - local_24d8) * local_24f0 + local_24e8) * 8)) *
                               local_2c40);
                  local_1194 = local_1744;
                  local_1198 = local_1740;
                  local_11a0 = 2;
                  local_11ac = local_1744;
                  local_11b0 = local_1740;
                  local_11b8 = 2;
                  local_11c8 = local_1740 + -1;
                  local_11c4 = local_1744;
                  local_11d0 = 2;
                  local_11e0 = local_1740 + -1;
                  local_11dc = local_1744;
                  local_11e8 = 2;
                  local_1798 = local_1fa8.arr[2] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_1744 - local_24e0) +
                                   (local_1740 - local_24dc) * local_24f8 +
                                   (local_177c - local_24d8) * local_24f0 + local_24e8 * 2) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_1744 - local_24e0) +
                                  (local_1740 - local_24dc) * local_24f8 +
                                  (local_1780 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                                local_2c28 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_1744 - local_24e0) +
                                  (local_11c8 - local_24dc) * local_24f8 +
                                  (local_1784 - local_24d8) * local_24f0 + local_24e8 * 2) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_1744 - local_24e0) +
                                 (local_11e0 - local_24dc) * local_24f8 +
                                 (local_1788 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                               local_2c40);
                  local_17a0 = local_1770 + local_1798;
                  local_30c = local_1744;
                  local_310 = local_1740;
                  local_314 = local_173c;
                  local_17a8 = *(double *)
                                (local_2640 +
                                ((long)(local_1744 - local_2620) +
                                 (local_1740 - local_261c) * local_2638 +
                                (local_173c - local_2618) * local_2630) * 8);
                  local_11f4 = local_1744;
                  local_11f8 = local_1740;
                  local_11fc = local_173c;
                  local_1200 = 1;
                  local_17b0 = (*(double *)
                                 (local_2580 +
                                 ((long)(local_1744 - local_2560) +
                                  (local_1740 - local_255c) * local_2578 +
                                  (local_173c - local_2558) * local_2570 + local_2568) * 8) -
                               local_17a8) * 0.75;
                  local_120c = local_1744;
                  local_1210 = local_1740;
                  local_1214 = local_173c;
                  local_1218 = 0;
                  local_17b8 = *(double *)
                                (local_2580 +
                                ((long)(local_1744 - local_2560) +
                                 (local_1740 - local_255c) * local_2578 +
                                (local_173c - local_2558) * local_2570) * 8);
                  local_1614 = local_1744;
                  local_1618 = local_1740;
                  local_161c = local_173c;
                  local_1620 = 0;
                  *(double *)
                   (local_2480 +
                   ((long)(local_1744 - local_2460) + (local_1740 - local_245c) * local_2478 +
                   (local_173c - local_2458) * local_2470) * 8) = -local_17b8 * local_1778;
                  local_162c = local_1744;
                  local_1630 = local_1740;
                  local_1634 = local_173c;
                  local_1638 = 1;
                  *(double *)
                   (local_2480 +
                   ((long)(local_1744 - local_2460) + (local_1740 - local_245c) * local_2478 +
                    (local_173c - local_2458) * local_2470 + local_2468) * 8) =
                       -local_17b0 * local_17a0 * -0.6666666666666666 + -(local_17a8 * local_17a0);
                  local_1644 = local_1744;
                  local_1648 = local_1740;
                  local_164c = local_173c;
                  local_1650 = 2;
                  *(double *)
                   (local_2480 +
                   ((long)(local_1744 - local_2460) + (local_1740 - local_245c) * local_2478 +
                    (local_173c - local_2458) * local_2470 + local_2468 * 2) * 8) =
                       -local_17b8 * local_1790;
                  local_1640 = local_16b0;
                  local_1628 = local_16b0;
                  local_1610 = local_16b0;
                  local_1208 = local_16c0;
                  local_11f0 = local_16c0;
                  local_11e4 = local_1788;
                  local_11d8 = local_16b8;
                  local_11cc = local_1784;
                  local_11c0 = local_16b8;
                  local_11b4 = local_1780;
                  local_11a8 = local_16b8;
                  local_119c = local_177c;
                  local_1190 = local_16b8;
                  local_1184 = local_1788;
                  local_1178 = local_16b8;
                  local_116c = local_1784;
                  local_1160 = local_16b8;
                  local_1154 = local_1780;
                  local_1148 = local_16b8;
                  local_113c = local_177c;
                  local_1130 = local_16b8;
                  local_111c = local_1754;
                  local_1118 = local_16b8;
                  local_1104 = local_1750;
                  local_1100 = local_16b8;
                  local_10ec = local_174c;
                  local_10e8 = local_16b8;
                  local_10d4 = local_1748;
                  local_10d0 = local_16b8;
                  local_10bc = local_1754;
                  local_10b8 = local_16b8;
                  local_10a4 = local_1750;
                  local_10a0 = local_16b8;
                  local_108c = local_174c;
                  local_1088 = local_16b8;
                  local_1074 = local_1748;
                  local_1070 = local_16b8;
                  local_308 = local_16c8;
                }
                else {
                  local_15cc = local_1744;
                  local_15d0 = local_1740;
                  local_15d4 = local_173c;
                  local_15d8 = 0;
                  *(undefined8 *)
                   (local_2480 +
                   ((long)(local_1744 - local_2460) + (local_1740 - local_245c) * local_2478 +
                   (local_173c - local_2458) * local_2470) * 8) = 0;
                  local_15e4 = local_1744;
                  local_15e8 = local_1740;
                  local_15ec = local_173c;
                  local_15f0 = 1;
                  *(undefined8 *)
                   (local_2480 +
                   ((long)(local_1744 - local_2460) + (local_1740 - local_245c) * local_2478 +
                    (local_173c - local_2458) * local_2470 + local_2468) * 8) = 0;
                  local_15fc = local_1744;
                  local_1600 = local_1740;
                  local_1604 = local_173c;
                  local_1608 = 2;
                  *(undefined8 *)
                   (local_2480 +
                   ((long)(local_1744 - local_2460) + (local_1740 - local_245c) * local_2478 +
                    (local_173c - local_2458) * local_2470 + local_2468 * 2) * 8) = 0;
                  local_15f8 = local_16b0;
                  local_15e0 = local_16b0;
                  local_15c8 = local_16b0;
                }
                iVar2 = local_1744 + 1;
              }
              iVar2 = local_1740 + 1;
            }
          }
          local_16a8 = &local_2a1c;
          local_1690 = &local_2a1c;
          local_1668 = &local_2a1c;
          local_910 = &local_2a1c;
          local_900 = &local_2a1c;
          local_8f0 = &local_2a1c;
          local_620 = local_16e0;
          local_610 = local_16e0;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_29e8);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffd320);
        local_2a28 = local_2a50;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_ffffffffffffd320);
        while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_2a68,&local_2a80), bVar3) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_2a9c,&local_2a68);
          local_14b8 = &local_24c0;
          local_14c0 = &local_2500;
          local_14c8 = &local_25c0;
          local_14d0 = &local_2680;
          local_14d8 = local_2898;
          local_14e0 = local_28e0;
          local_14e8 = &local_1fa8;
          local_634 = 0;
          local_644 = 1;
          local_954 = 0;
          local_964 = 1;
          local_974 = 2;
          local_980 = &local_2a9c.bigend;
          local_984 = 0;
          local_990 = &local_2a9c.bigend;
          local_994 = 1;
          local_9a0 = &local_2a9c.bigend;
          local_9a4 = 2;
          local_1540 = 0x3fe5555555555555;
          for (local_1544 = local_2a9c.smallend.vect[2]; iVar2 = local_2a9c.smallend.vect[1],
              local_1544 <= local_2a9c.bigend.vect[2]; local_1544 = local_1544 + 1) {
            while (local_1548 = iVar2, iVar2 = local_2a9c.smallend.vect[0],
                  local_1548 <= local_2a9c.bigend.vect[1]) {
              while (local_154c = iVar2, local_154c <= local_2a9c.bigend.vect[0]) {
                local_320 = local_2898;
                local_324 = local_154c;
                local_328 = local_1548;
                local_32c = local_1544;
                dVar1 = *(double *)
                         (*local_2898 +
                         ((long)(local_154c - (int)local_2898[4]) +
                          (long)(local_1548 - *(int *)((long)local_2898 + 0x24)) * local_2898[1] +
                         (long)(local_1544 - (int)local_2898[5]) * local_2898[2]) * 8);
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  local_4d0 = local_28e0;
                  local_4d4 = local_154c;
                  local_4d8 = local_1548;
                  local_4dc = local_1544;
                  local_1b8 = (uint *)(*local_28e0 +
                                      ((long)(local_154c - (int)local_28e0[4]) +
                                       (long)(local_1548 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_1544 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_1bc = 1;
                  local_1c0 = 0;
                  local_1c4 = 0;
                  local_1c8 = 0x13;
                  local_1550 = local_154c + (uint)((*local_1b8 & 0x80000) != 0);
                  local_4e8 = local_28e0;
                  local_4ec = local_154c;
                  local_4f0 = local_1548;
                  local_4f4 = local_1544;
                  local_1d0 = (uint *)(*local_28e0 +
                                      ((long)(local_154c - (int)local_28e0[4]) +
                                       (long)(local_1548 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_1544 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_1d4 = 0xffffffff;
                  local_1d8 = 0;
                  local_1dc = 0;
                  local_1e0 = 0x11;
                  local_1554 = local_154c - (uint)((*local_1d0 & 0x20000) != 0);
                  local_50c = local_1544 + -1;
                  local_500 = local_28e0;
                  local_504 = local_154c;
                  local_508 = local_1548;
                  local_1e8 = (uint *)(*local_28e0 +
                                      ((long)(local_154c - (int)local_28e0[4]) +
                                       (long)(local_1548 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_50c - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_1ec = 1;
                  local_1f0 = 0;
                  local_1f4 = 0;
                  local_1f8 = 0x13;
                  local_1558 = local_154c + (uint)((*local_1e8 & 0x80000) != 0);
                  local_524 = local_1544 + -1;
                  local_518 = local_28e0;
                  local_51c = local_154c;
                  local_520 = local_1548;
                  local_200 = (uint *)(*local_28e0 +
                                      ((long)(local_154c - (int)local_28e0[4]) +
                                       (long)(local_1548 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_524 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_204 = 0xffffffff;
                  local_208 = 0;
                  local_20c = 0;
                  local_210 = 0x11;
                  local_155c = local_154c - (uint)((*local_200 & 0x20000) != 0);
                  local_24 = local_1550 - local_1554;
                  if (local_24 == 2) {
                    in_stack_ffffffffffffd390 = (MFIter *)0x3fe0000000000000;
                  }
                  else {
                    in_stack_ffffffffffffd380 = (MFIter *)0x0;
                    in_stack_ffffffffffffd388 = (MFIter *)&DAT_3ff0000000000000;
                    in_stack_ffffffffffffd390 = in_stack_ffffffffffffd388;
                    if (local_24 != 1) {
                      in_stack_ffffffffffffd388 = (MFIter *)0x0;
                      in_stack_ffffffffffffd390 = in_stack_ffffffffffffd388;
                    }
                  }
                  local_28 = local_1558 - local_155c;
                  if (local_28 == 2) {
                    local_2c88 = 0.5;
                  }
                  else {
                    local_2c90 = 1.0;
                    if (local_28 != 1) {
                      local_2c90 = 0.0;
                    }
                    local_2c88 = local_2c90;
                  }
                  local_1228 = local_1548;
                  local_122c = local_1544;
                  local_1230 = 0;
                  local_1240 = local_1548;
                  local_1244 = local_1544;
                  local_1248 = 0;
                  local_125c = local_1544 + -1;
                  local_1258 = local_1548;
                  local_1260 = 0;
                  local_1274 = local_1544 + -1;
                  local_1270 = local_1548;
                  local_1278 = 0;
                  local_1578 = local_1fa8.arr[0] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_1550 - local_24e0) +
                                   (local_1548 - local_24dc) * local_24f8 +
                                  (local_1544 - local_24d8) * local_24f0) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_1554 - local_24e0) +
                                  (local_1548 - local_24dc) * local_24f8 +
                                 (local_1544 - local_24d8) * local_24f0) * 8)) *
                                (double)in_stack_ffffffffffffd390 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_1558 - local_24e0) +
                                  (local_1548 - local_24dc) * local_24f8 +
                                 (local_125c - local_24d8) * local_24f0) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_155c - local_24e0) +
                                 (local_1548 - local_24dc) * local_24f8 +
                                (local_1274 - local_24d8) * local_24f0) * 8)) * local_2c88);
                  local_1288 = local_1548;
                  local_128c = local_1544;
                  local_1290 = 2;
                  local_12a0 = local_1548;
                  local_12a4 = local_1544;
                  local_12a8 = 2;
                  local_12bc = local_1544 + -1;
                  local_12b8 = local_1548;
                  local_12c0 = 2;
                  local_12d4 = local_1544 + -1;
                  local_12d0 = local_1548;
                  local_12d8 = 2;
                  local_1580 = local_1fa8.arr[0] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_1550 - local_24e0) +
                                   (local_1548 - local_24dc) * local_24f8 +
                                   (local_1544 - local_24d8) * local_24f0 + local_24e8 * 2) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_1554 - local_24e0) +
                                  (local_1548 - local_24dc) * local_24f8 +
                                  (local_1544 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                                (double)in_stack_ffffffffffffd390 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_1558 - local_24e0) +
                                  (local_1548 - local_24dc) * local_24f8 +
                                  (local_12bc - local_24d8) * local_24f0 + local_24e8 * 2) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_155c - local_24e0) +
                                 (local_1548 - local_24dc) * local_24f8 +
                                 (local_12d4 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                               local_2c88);
                  local_530 = local_28e0;
                  local_534 = local_154c;
                  local_538 = local_1548;
                  local_53c = local_1544;
                  local_218 = (uint *)(*local_28e0 +
                                      ((long)(local_154c - (int)local_28e0[4]) +
                                       (long)(local_1548 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_1544 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_21c = 0;
                  local_220 = 1;
                  local_224 = 0;
                  local_228 = 0x15;
                  local_1584 = local_1548 + (uint)((*local_218 & 0x200000) != 0);
                  local_548 = local_28e0;
                  local_54c = local_154c;
                  local_550 = local_1548;
                  local_554 = local_1544;
                  local_230 = (uint *)(*local_28e0 +
                                      ((long)(local_154c - (int)local_28e0[4]) +
                                       (long)(local_1548 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_1544 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_234 = 0;
                  local_238 = 0xffffffff;
                  local_23c = 0;
                  local_240 = 0xf;
                  local_1588 = local_1548 - (uint)((*local_230 & 0x8000) != 0);
                  local_56c = local_1544 + -1;
                  local_560 = local_28e0;
                  local_564 = local_154c;
                  local_568 = local_1548;
                  local_248 = (uint *)(*local_28e0 +
                                      ((long)(local_154c - (int)local_28e0[4]) +
                                       (long)(local_1548 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_56c - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_24c = 0;
                  local_250 = 1;
                  local_254 = 0;
                  local_258 = 0x15;
                  local_158c = local_1548 + (uint)((*local_248 & 0x200000) != 0);
                  local_584 = local_1544 + -1;
                  local_578 = local_28e0;
                  local_57c = local_154c;
                  local_580 = local_1548;
                  local_260 = (uint *)(*local_28e0 +
                                      ((long)(local_154c - (int)local_28e0[4]) +
                                       (long)(local_1548 - *(int *)((long)local_28e0 + 0x24)) *
                                       local_28e0[1] +
                                      (long)(local_584 - (int)local_28e0[5]) * local_28e0[2]) * 4);
                  local_264 = 0;
                  local_268 = 0xffffffff;
                  local_26c = 0;
                  local_270 = 0xf;
                  local_1590 = local_1548 - (uint)((*local_260 & 0x8000) != 0);
                  local_2c = local_1584 - local_1588;
                  if (local_2c == 2) {
                    in_stack_ffffffffffffd350 = (Geometry *)0x3fe0000000000000;
                  }
                  else {
                    in_stack_ffffffffffffd340 = (FabArray<amrex::FArrayBox> *)0x0;
                    in_stack_ffffffffffffd350 = (Geometry *)&DAT_3ff0000000000000;
                    if (local_2c != 1) {
                      in_stack_ffffffffffffd350 = (Geometry *)0x0;
                    }
                  }
                  local_30 = local_158c - local_1590;
                  if (local_30 == 2) {
                    in_stack_ffffffffffffd338 = (MFItInfo *)0x3fe0000000000000;
                  }
                  else {
                    in_stack_ffffffffffffd328 = (FabArray<amrex::EBCellFlagFab> *)0x0;
                    in_stack_ffffffffffffd330 = (MFItInfo *)&DAT_3ff0000000000000;
                    in_stack_ffffffffffffd338 = in_stack_ffffffffffffd330;
                    if (local_30 != 1) {
                      in_stack_ffffffffffffd330 = (MFItInfo *)0x0;
                      in_stack_ffffffffffffd338 = in_stack_ffffffffffffd330;
                    }
                  }
                  local_12e4 = local_154c;
                  local_12ec = local_1544;
                  local_12f0 = 1;
                  local_12fc = local_154c;
                  local_1304 = local_1544;
                  local_1308 = 1;
                  local_131c = local_1544 + -1;
                  local_1314 = local_154c;
                  local_1320 = 1;
                  local_1334 = local_1544 + -1;
                  local_132c = local_154c;
                  local_1338 = 1;
                  local_1598 = local_1fa8.arr[1] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_154c - local_24e0) +
                                   (local_1584 - local_24dc) * local_24f8 +
                                   (local_1544 - local_24d8) * local_24f0 + local_24e8) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_154c - local_24e0) +
                                  (local_1588 - local_24dc) * local_24f8 +
                                  (local_1544 - local_24d8) * local_24f0 + local_24e8) * 8)) *
                                (double)in_stack_ffffffffffffd350 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_154c - local_24e0) +
                                  (local_158c - local_24dc) * local_24f8 +
                                  (local_131c - local_24d8) * local_24f0 + local_24e8) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_154c - local_24e0) +
                                 (local_1590 - local_24dc) * local_24f8 +
                                 (local_1334 - local_24d8) * local_24f0 + local_24e8) * 8)) *
                               (double)in_stack_ffffffffffffd338);
                  local_1344 = local_154c;
                  local_134c = local_1544;
                  local_1350 = 2;
                  local_135c = local_154c;
                  local_1364 = local_1544;
                  local_1368 = 2;
                  local_137c = local_1544 + -1;
                  local_1374 = local_154c;
                  local_1380 = 2;
                  local_1394 = local_1544 + -1;
                  local_138c = local_154c;
                  local_1398 = 2;
                  local_15a0 = local_1fa8.arr[1] * 0.5 *
                               ((*(double *)
                                  (local_2500 +
                                  ((long)(local_154c - local_24e0) +
                                   (local_1584 - local_24dc) * local_24f8 +
                                   (local_1544 - local_24d8) * local_24f0 + local_24e8 * 2) * 8) -
                                *(double *)
                                 (local_2500 +
                                 ((long)(local_154c - local_24e0) +
                                  (local_1588 - local_24dc) * local_24f8 +
                                  (local_1544 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                                (double)in_stack_ffffffffffffd350 +
                               (*(double *)
                                 (local_2500 +
                                 ((long)(local_154c - local_24e0) +
                                  (local_158c - local_24dc) * local_24f8 +
                                  (local_137c - local_24d8) * local_24f0 + local_24e8 * 2) * 8) -
                               *(double *)
                                (local_2500 +
                                ((long)(local_154c - local_24e0) +
                                 (local_1590 - local_24dc) * local_24f8 +
                                 (local_1394 - local_24d8) * local_24f0 + local_24e8 * 2) * 8)) *
                               (double)in_stack_ffffffffffffd338);
                  local_15a8 = local_1578 + local_1598;
                  local_33c = local_154c;
                  local_340 = local_1548;
                  local_344 = local_1544;
                  local_15b0 = *(double *)
                                (local_2680 +
                                ((long)(local_154c - local_2660) +
                                 (local_1548 - local_265c) * local_2678 +
                                (local_1544 - local_2658) * local_2670) * 8);
                  local_13a4 = local_154c;
                  local_13a8 = local_1548;
                  local_13ac = local_1544;
                  local_13b0 = 2;
                  local_15b8 = (*(double *)
                                 (local_25c0 +
                                 ((long)(local_154c - local_25a0) +
                                  (local_1548 - local_259c) * local_25b8 +
                                  (local_1544 - local_2598) * local_25b0 + local_25a8 * 2) * 8) -
                               local_15b0) * 0.75;
                  local_13bc = local_154c;
                  local_13c0 = local_1548;
                  local_13c4 = local_1544;
                  local_13c8 = 0;
                  local_15c0 = *(double *)
                                (local_25c0 +
                                ((long)(local_154c - local_25a0) +
                                 (local_1548 - local_259c) * local_25b8 +
                                (local_1544 - local_2598) * local_25b0) * 8);
                  local_141c = local_154c;
                  local_1420 = local_1548;
                  local_1424 = local_1544;
                  local_1428 = 0;
                  *(double *)
                   (local_24c0 +
                   ((long)(local_154c - local_24a0) + (local_1548 - local_249c) * local_24b8 +
                   (local_1544 - local_2498) * local_24b0) * 8) = -local_15c0 * local_1580;
                  local_1434 = local_154c;
                  local_1438 = local_1548;
                  local_143c = local_1544;
                  local_1440 = 1;
                  *(double *)
                   (local_24c0 +
                   ((long)(local_154c - local_24a0) + (local_1548 - local_249c) * local_24b8 +
                    (local_1544 - local_2498) * local_24b0 + local_24a8) * 8) =
                       -local_15c0 * local_15a0;
                  local_144c = local_154c;
                  local_1450 = local_1548;
                  local_1454 = local_1544;
                  local_1458 = 2;
                  *(double *)
                   (local_24c0 +
                   ((long)(local_154c - local_24a0) + (local_1548 - local_249c) * local_24b8 +
                    (local_1544 - local_2498) * local_24b0 + local_24a8 * 2) * 8) =
                       -local_15b8 * local_15a8 * -0.6666666666666666 + -(local_15b0 * local_15a8);
                  local_1570 = in_stack_ffffffffffffd338;
                  local_1568 = in_stack_ffffffffffffd350;
                  local_1448 = local_14b8;
                  local_1430 = local_14b8;
                  local_1418 = local_14b8;
                  local_13b8 = local_14c8;
                  local_13a0 = local_14c8;
                  local_1390 = local_1590;
                  local_1388 = local_14c0;
                  local_1378 = local_158c;
                  local_1370 = local_14c0;
                  local_1360 = local_1588;
                  local_1358 = local_14c0;
                  local_1348 = local_1584;
                  local_1340 = local_14c0;
                  local_1330 = local_1590;
                  local_1328 = local_14c0;
                  local_1318 = local_158c;
                  local_1310 = local_14c0;
                  local_1300 = local_1588;
                  local_12f8 = local_14c0;
                  local_12e8 = local_1584;
                  local_12e0 = local_14c0;
                  local_12cc = local_155c;
                  local_12c8 = local_14c0;
                  local_12b4 = local_1558;
                  local_12b0 = local_14c0;
                  local_129c = local_1554;
                  local_1298 = local_14c0;
                  local_1284 = local_1550;
                  local_1280 = local_14c0;
                  local_126c = local_155c;
                  local_1268 = local_14c0;
                  local_1254 = local_1558;
                  local_1250 = local_14c0;
                  local_123c = local_1554;
                  local_1238 = local_14c0;
                  local_1224 = local_1550;
                  local_1220 = local_14c0;
                  local_338 = local_14d0;
                }
                else {
                  local_13d4 = local_154c;
                  local_13d8 = local_1548;
                  local_13dc = local_1544;
                  local_13e0 = 0;
                  *(undefined8 *)
                   (local_24c0 +
                   ((long)(local_154c - local_24a0) + (local_1548 - local_249c) * local_24b8 +
                   (local_1544 - local_2498) * local_24b0) * 8) = 0;
                  local_13ec = local_154c;
                  local_13f0 = local_1548;
                  local_13f4 = local_1544;
                  local_13f8 = 1;
                  *(undefined8 *)
                   (local_24c0 +
                   ((long)(local_154c - local_24a0) + (local_1548 - local_249c) * local_24b8 +
                    (local_1544 - local_2498) * local_24b0 + local_24a8) * 8) = 0;
                  local_1404 = local_154c;
                  local_1408 = local_1548;
                  local_140c = local_1544;
                  local_1410 = 2;
                  *(undefined8 *)
                   (local_24c0 +
                   ((long)(local_154c - local_24a0) + (local_1548 - local_249c) * local_24b8 +
                    (local_1544 - local_2498) * local_24b0 + local_24a8 * 2) * 8) = 0;
                  local_1400 = local_14b8;
                  local_13e8 = local_14b8;
                  local_13d0 = local_14b8;
                }
                iVar2 = local_154c + 1;
              }
              iVar2 = local_1548 + 1;
            }
          }
          local_14b0 = &local_2a9c;
          local_1498 = &local_2a9c;
          local_1470 = &local_2a9c;
          local_970 = &local_2a9c;
          local_960 = &local_2a9c;
          local_950 = &local_2a9c;
          local_640 = local_14e8;
          local_630 = local_14e8;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_2a68);
        }
      }
    }
    MFIter::operator++(&local_2038);
  }
  MFIter::~MFIter((MFIter *)in_stack_ffffffffffffd320);
  for (local_2aa0 = 0; local_2aa0 < 3; local_2aa0 = local_2aa0 + 1) {
    in_stack_ffffffffffffd320 =
         (MultiCutFab *)
         std::array<amrex::MultiFab,_3UL>::operator[]
                   ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffd320,
                    (size_type)in_stack_ffffffffffffd318);
    Geometry::periodicity(in_stack_ffffffffffffd350);
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_ffffffffffffd340,(int)((ulong)in_stack_ffffffffffffd338 >> 0x20),
               (int)in_stack_ffffffffffffd338,(Periodicity *)in_stack_ffffffffffffd330,
               SUB81((ulong)in_stack_ffffffffffffd328 >> 0x38,0));
  }
  return;
}

Assistant:

void
MLEBTensorOp::compCrossTerms(int amrlev, int mglev, MultiFab const& mf) const
{
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    Array<MultiFab,AMREX_SPACEDIM> const& etamf = m_b_coeffs[amrlev][mglev];
    Array<MultiFab,AMREX_SPACEDIM> const& kapmf = m_kappa[amrlev][mglev];
    Array<MultiFab,AMREX_SPACEDIM>& fluxmf = m_tauflux[amrlev][mglev];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        AMREX_D_TERM(Box const xbx = mfi.nodaltilebox(0);,
                     Box const ybx = mfi.nodaltilebox(1);,
                     Box const zbx = mfi.nodaltilebox(2););

        // grow by 1 because of corners
        auto fabtyp = (flags) ? (*flags)[mfi].getType(amrex::grow(bx,1)) : FabType::regular;

        if (fabtyp == FabType::covered) {
          AMREX_D_TERM(Array4<Real> const& fxfab = fluxmf[0].array(mfi);,
                       Array4<Real> const& fyfab = fluxmf[1].array(mfi);,
                       Array4<Real> const& fzfab = fluxmf[2].array(mfi););
          AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
          ( xbx, txbx,
            {
                AMREX_LOOP_4D(txbx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fxfab(i,j,k,n) = 0.0;
                });
            }
            , ybx, tybx,
            {
                AMREX_LOOP_4D(tybx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fyfab(i,j,k,n) = 0.0;
                });
            }
            , zbx, tzbx,
            {
                AMREX_LOOP_4D(tzbx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fzfab(i,j,k,n) = 0.0;
                });
            }
          );
        } else {
          AMREX_D_TERM(Array4<Real> const fxfab = fluxmf[0].array(mfi);,
                       Array4<Real> const fyfab = fluxmf[1].array(mfi);,
                       Array4<Real> const fzfab = fluxmf[2].array(mfi););
          Array4<Real const> const vfab = mf.const_array(mfi);
          AMREX_D_TERM(Array4<Real const> const etaxfab = etamf[0].const_array(mfi);,
                       Array4<Real const> const etayfab = etamf[1].const_array(mfi);,
                       Array4<Real const> const etazfab = etamf[2].const_array(mfi););
          AMREX_D_TERM(Array4<Real const> const kapxfab = kapmf[0].const_array(mfi);,
                       Array4<Real const> const kapyfab = kapmf[1].const_array(mfi);,
                       Array4<Real const> const kapzfab = kapmf[2].const_array(mfi););

          if (fabtyp == FabType::regular)
          {
              AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
              ( xbx, txbx,
                {
                  mltensor_cross_terms_fx(txbx,fxfab,vfab,etaxfab,kapxfab,dxinv);
                }
                , ybx, tybx,
                {
                  mltensor_cross_terms_fy(tybx,fyfab,vfab,etayfab,kapyfab,dxinv);
                }
                , zbx, tzbx,
                {
                  mltensor_cross_terms_fz(tzbx,fzfab,vfab,etazfab,kapzfab,dxinv);
                }
              );
          }
          else
          {
            AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                         Array4<Real const> const& apy = area[1]->const_array(mfi);,
                         Array4<Real const> const& apz = area[2]->const_array(mfi););
            Array4<EBCellFlag const> const& flag = flags->const_array(mfi);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
            ( xbx, txbx,
              {
                mlebtensor_cross_terms_fx(txbx,fxfab,vfab,etaxfab,kapxfab,apx,flag,dxinv);
              }
              , ybx, tybx,
              {
                mlebtensor_cross_terms_fy(tybx,fyfab,vfab,etayfab,kapyfab,apy,flag,dxinv);
              }
              , zbx, tzbx,
              {
                mlebtensor_cross_terms_fz(tzbx,fzfab,vfab,etazfab,kapzfab,apz,flag,dxinv);
              }
              );
          }
        }
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        fluxmf[idim].FillBoundary(0, AMREX_SPACEDIM, geom.periodicity());
    }
}